

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 uVar6;
  ulong uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  byte bVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  long lVar60;
  uint uVar61;
  ulong uVar63;
  undefined4 uVar64;
  undefined8 in_R11;
  bool bVar65;
  ulong uVar66;
  vint4 bi_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar69 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar92;
  float fVar120;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar93;
  float fVar121;
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar98 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 ai;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar160;
  float fVar161;
  vint4 ai_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar162;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  float fVar163;
  float fVar178;
  float fVar179;
  undefined1 auVar164 [16];
  float fVar180;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  vint4 bi;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vint4 ai_1;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar209;
  float fVar220;
  float fVar221;
  vfloat4 b0;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar222;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar244 [32];
  float fVar246;
  undefined1 auVar245 [32];
  float fVar250;
  float fVar258;
  float fVar259;
  __m128 a;
  float fVar260;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  float fVar261;
  float fVar269;
  float fVar270;
  vfloat4 a0_1;
  float fVar271;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  float fVar272;
  float fVar275;
  float fVar276;
  undefined1 auVar273 [16];
  float fVar277;
  undefined1 auVar274 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar286;
  float fVar287;
  undefined1 auVar283 [16];
  float fVar288;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar289;
  float fVar290;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar297 [64];
  float fVar304;
  vfloat4 a0;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  uint auStack_4c0 [4];
  RTCFilterFunctionNArguments local_4b0;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar62;
  undefined1 auVar208 [32];
  undefined1 auVar296 [32];
  
  PVar8 = prim[1];
  uVar59 = (ulong)(byte)PVar8;
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar201 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar201 = vinsertps_avx(auVar201,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar149 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar73 = vsubps_avx(auVar73,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar94._0_4_ = fVar149 * auVar73._0_4_;
  auVar94._4_4_ = fVar149 * auVar73._4_4_;
  auVar94._8_4_ = fVar149 * auVar73._8_4_;
  auVar94._12_4_ = fVar149 * auVar73._12_4_;
  auVar210._0_4_ = fVar149 * auVar201._0_4_;
  auVar210._4_4_ = fVar149 * auVar201._4_4_;
  auVar210._8_4_ = fVar149 * auVar201._8_4_;
  auVar210._12_4_ = fVar149 * auVar201._12_4_;
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar264 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xc + 6)));
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xd + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x12 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x13 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x14 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar67 = vshufps_avx(auVar210,auVar210,0);
  auVar95 = vshufps_avx(auVar210,auVar210,0x55);
  auVar122 = vshufps_avx(auVar210,auVar210,0xaa);
  fVar149 = auVar122._0_4_;
  fVar163 = auVar122._4_4_;
  fVar160 = auVar122._8_4_;
  fVar178 = auVar122._12_4_;
  fVar209 = auVar95._0_4_;
  fVar220 = auVar95._4_4_;
  fVar221 = auVar95._8_4_;
  fVar222 = auVar95._12_4_;
  fVar161 = auVar67._0_4_;
  fVar179 = auVar67._4_4_;
  fVar162 = auVar67._8_4_;
  fVar180 = auVar67._12_4_;
  auVar273._0_4_ = fVar161 * auVar73._0_4_ + fVar209 * auVar201._0_4_ + fVar149 * auVar144._0_4_;
  auVar273._4_4_ = fVar179 * auVar73._4_4_ + fVar220 * auVar201._4_4_ + fVar163 * auVar144._4_4_;
  auVar273._8_4_ = fVar162 * auVar73._8_4_ + fVar221 * auVar201._8_4_ + fVar160 * auVar144._8_4_;
  auVar273._12_4_ = fVar180 * auVar73._12_4_ + fVar222 * auVar201._12_4_ + fVar178 * auVar144._12_4_
  ;
  auVar283._0_4_ = fVar161 * auVar15._0_4_ + fVar209 * auVar264._0_4_ + auVar16._0_4_ * fVar149;
  auVar283._4_4_ = fVar179 * auVar15._4_4_ + fVar220 * auVar264._4_4_ + auVar16._4_4_ * fVar163;
  auVar283._8_4_ = fVar162 * auVar15._8_4_ + fVar221 * auVar264._8_4_ + auVar16._8_4_ * fVar160;
  auVar283._12_4_ = fVar180 * auVar15._12_4_ + fVar222 * auVar264._12_4_ + auVar16._12_4_ * fVar178;
  auVar211._0_4_ = fVar161 * auVar68._0_4_ + fVar209 * auVar100._0_4_ + auVar130._0_4_ * fVar149;
  auVar211._4_4_ = fVar179 * auVar68._4_4_ + fVar220 * auVar100._4_4_ + auVar130._4_4_ * fVar163;
  auVar211._8_4_ = fVar162 * auVar68._8_4_ + fVar221 * auVar100._8_4_ + auVar130._8_4_ * fVar160;
  auVar211._12_4_ = fVar180 * auVar68._12_4_ + fVar222 * auVar100._12_4_ + auVar130._12_4_ * fVar178
  ;
  auVar67 = vshufps_avx(auVar94,auVar94,0);
  auVar95 = vshufps_avx(auVar94,auVar94,0x55);
  auVar122 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar149 = auVar122._0_4_;
  fVar163 = auVar122._4_4_;
  fVar160 = auVar122._8_4_;
  fVar178 = auVar122._12_4_;
  fVar209 = auVar95._0_4_;
  fVar220 = auVar95._4_4_;
  fVar221 = auVar95._8_4_;
  fVar222 = auVar95._12_4_;
  fVar161 = auVar67._0_4_;
  fVar179 = auVar67._4_4_;
  fVar162 = auVar67._8_4_;
  fVar180 = auVar67._12_4_;
  auVar181._0_4_ = fVar161 * auVar73._0_4_ + fVar209 * auVar201._0_4_ + fVar149 * auVar144._0_4_;
  auVar181._4_4_ = fVar179 * auVar73._4_4_ + fVar220 * auVar201._4_4_ + fVar163 * auVar144._4_4_;
  auVar181._8_4_ = fVar162 * auVar73._8_4_ + fVar221 * auVar201._8_4_ + fVar160 * auVar144._8_4_;
  auVar181._12_4_ = fVar180 * auVar73._12_4_ + fVar222 * auVar201._12_4_ + fVar178 * auVar144._12_4_
  ;
  auVar95._0_4_ = fVar161 * auVar15._0_4_ + auVar16._0_4_ * fVar149 + fVar209 * auVar264._0_4_;
  auVar95._4_4_ = fVar179 * auVar15._4_4_ + auVar16._4_4_ * fVar163 + fVar220 * auVar264._4_4_;
  auVar95._8_4_ = fVar162 * auVar15._8_4_ + auVar16._8_4_ * fVar160 + fVar221 * auVar264._8_4_;
  auVar95._12_4_ = fVar180 * auVar15._12_4_ + auVar16._12_4_ * fVar178 + fVar222 * auVar264._12_4_;
  auVar67._0_4_ = fVar209 * auVar100._0_4_ + auVar130._0_4_ * fVar149 + fVar161 * auVar68._0_4_;
  auVar67._4_4_ = fVar220 * auVar100._4_4_ + auVar130._4_4_ * fVar163 + fVar179 * auVar68._4_4_;
  auVar67._8_4_ = fVar221 * auVar100._8_4_ + auVar130._8_4_ * fVar160 + fVar162 * auVar68._8_4_;
  auVar67._12_4_ = fVar222 * auVar100._12_4_ + auVar130._12_4_ * fVar178 + fVar180 * auVar68._12_4_;
  auVar196._8_4_ = 0x7fffffff;
  auVar196._0_8_ = 0x7fffffff7fffffff;
  auVar196._12_4_ = 0x7fffffff;
  auVar73 = vandps_avx(auVar273,auVar196);
  auVar150._8_4_ = 0x219392ef;
  auVar150._0_8_ = 0x219392ef219392ef;
  auVar150._12_4_ = 0x219392ef;
  auVar73 = vcmpps_avx(auVar73,auVar150,1);
  auVar201 = vblendvps_avx(auVar273,auVar150,auVar73);
  auVar73 = vandps_avx(auVar283,auVar196);
  auVar73 = vcmpps_avx(auVar73,auVar150,1);
  auVar144 = vblendvps_avx(auVar283,auVar150,auVar73);
  auVar73 = vandps_avx(auVar211,auVar196);
  auVar73 = vcmpps_avx(auVar73,auVar150,1);
  auVar73 = vblendvps_avx(auVar211,auVar150,auVar73);
  auVar15 = vrcpps_avx(auVar201);
  fVar209 = auVar15._0_4_;
  auVar122._0_4_ = fVar209 * auVar201._0_4_;
  fVar220 = auVar15._4_4_;
  auVar122._4_4_ = fVar220 * auVar201._4_4_;
  fVar221 = auVar15._8_4_;
  auVar122._8_4_ = fVar221 * auVar201._8_4_;
  fVar222 = auVar15._12_4_;
  auVar122._12_4_ = fVar222 * auVar201._12_4_;
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar201 = vsubps_avx(auVar223,auVar122);
  fVar209 = fVar209 + fVar209 * auVar201._0_4_;
  fVar220 = fVar220 + fVar220 * auVar201._4_4_;
  fVar221 = fVar221 + fVar221 * auVar201._8_4_;
  fVar222 = fVar222 + fVar222 * auVar201._12_4_;
  auVar201 = vrcpps_avx(auVar144);
  fVar149 = auVar201._0_4_;
  auVar151._0_4_ = fVar149 * auVar144._0_4_;
  fVar160 = auVar201._4_4_;
  auVar151._4_4_ = fVar160 * auVar144._4_4_;
  fVar161 = auVar201._8_4_;
  auVar151._8_4_ = fVar161 * auVar144._8_4_;
  fVar162 = auVar201._12_4_;
  auVar151._12_4_ = fVar162 * auVar144._12_4_;
  auVar201 = vsubps_avx(auVar223,auVar151);
  fVar149 = fVar149 + fVar149 * auVar201._0_4_;
  fVar160 = fVar160 + fVar160 * auVar201._4_4_;
  fVar161 = fVar161 + fVar161 * auVar201._8_4_;
  fVar162 = fVar162 + fVar162 * auVar201._12_4_;
  auVar201 = vrcpps_avx(auVar73);
  fVar163 = auVar201._0_4_;
  auVar164._0_4_ = fVar163 * auVar73._0_4_;
  fVar178 = auVar201._4_4_;
  auVar164._4_4_ = fVar178 * auVar73._4_4_;
  fVar179 = auVar201._8_4_;
  auVar164._8_4_ = fVar179 * auVar73._8_4_;
  fVar180 = auVar201._12_4_;
  auVar164._12_4_ = fVar180 * auVar73._12_4_;
  auVar201 = vsubps_avx(auVar223,auVar164);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar73 = vpmovsxwd_avx(auVar73);
  fVar163 = fVar163 + fVar163 * auVar201._0_4_;
  fVar178 = fVar178 + fVar178 * auVar201._4_4_;
  fVar179 = fVar179 + fVar179 * auVar201._8_4_;
  fVar180 = fVar180 + fVar180 * auVar201._12_4_;
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar181);
  auVar123._0_4_ = fVar209 * auVar73._0_4_;
  auVar123._4_4_ = fVar220 * auVar73._4_4_;
  auVar123._8_4_ = fVar221 * auVar73._8_4_;
  auVar123._12_4_ = fVar222 * auVar73._12_4_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar73 = vpmovsxwd_avx(auVar201);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar201 = vsubps_avx(auVar73,auVar181);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar59 * 0xe + 6);
  auVar73 = vpmovsxwd_avx(auVar144);
  auVar182._0_4_ = fVar209 * auVar201._0_4_;
  auVar182._4_4_ = fVar220 * auVar201._4_4_;
  auVar182._8_4_ = fVar221 * auVar201._8_4_;
  auVar182._12_4_ = fVar222 * auVar201._12_4_;
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar95);
  auVar197._0_4_ = auVar73._0_4_ * fVar149;
  auVar197._4_4_ = auVar73._4_4_ * fVar160;
  auVar197._8_4_ = auVar73._8_4_ * fVar161;
  auVar197._12_4_ = auVar73._12_4_ * fVar162;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar73 = vpmovsxwd_avx(auVar15);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar95);
  auVar130._0_4_ = fVar149 * auVar73._0_4_;
  auVar130._4_4_ = fVar160 * auVar73._4_4_;
  auVar130._8_4_ = fVar161 * auVar73._8_4_;
  auVar130._12_4_ = fVar162 * auVar73._12_4_;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + uVar59 * 0x15 + 6);
  auVar73 = vpmovsxwd_avx(auVar264);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar201 = vsubps_avx(auVar73,auVar67);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar73 = vpmovsxwd_avx(auVar16);
  auVar152._0_4_ = auVar201._0_4_ * fVar163;
  auVar152._4_4_ = auVar201._4_4_ * fVar178;
  auVar152._8_4_ = auVar201._8_4_ * fVar179;
  auVar152._12_4_ = auVar201._12_4_ * fVar180;
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar67);
  auVar68._0_4_ = auVar73._0_4_ * fVar163;
  auVar68._4_4_ = auVar73._4_4_ * fVar178;
  auVar68._8_4_ = auVar73._8_4_ * fVar179;
  auVar68._12_4_ = auVar73._12_4_ * fVar180;
  auVar73 = vpminsd_avx(auVar123,auVar182);
  auVar201 = vpminsd_avx(auVar197,auVar130);
  auVar73 = vmaxps_avx(auVar73,auVar201);
  auVar201 = vpminsd_avx(auVar152,auVar68);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar235._4_4_ = uVar64;
  auVar235._0_4_ = uVar64;
  auVar235._8_4_ = uVar64;
  auVar235._12_4_ = uVar64;
  auVar201 = vmaxps_avx(auVar201,auVar235);
  auVar73 = vmaxps_avx(auVar73,auVar201);
  local_430._0_4_ = auVar73._0_4_ * 0.99999964;
  local_430._4_4_ = auVar73._4_4_ * 0.99999964;
  local_430._8_4_ = auVar73._8_4_ * 0.99999964;
  local_430._12_4_ = auVar73._12_4_ * 0.99999964;
  auVar73 = vpmaxsd_avx(auVar123,auVar182);
  auVar201 = vpmaxsd_avx(auVar197,auVar130);
  auVar73 = vminps_avx(auVar73,auVar201);
  auVar201 = vpmaxsd_avx(auVar152,auVar68);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar124._4_4_ = uVar64;
  auVar124._0_4_ = uVar64;
  auVar124._8_4_ = uVar64;
  auVar124._12_4_ = uVar64;
  auVar201 = vminps_avx(auVar201,auVar124);
  auVar73 = vminps_avx(auVar73,auVar201);
  auVar201 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar201 = vpcmpgtd_avx(auVar201,_DAT_01f4ad30);
  auVar100._0_4_ = auVar73._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar73._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar73._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar73._12_4_ * 1.0000004;
  auVar73 = vcmpps_avx(local_430,auVar100,2);
  auVar73 = vandps_avx(auVar73,auVar201);
  uVar64 = vmovmskps_avx(auVar73);
  uVar59 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar64);
  auVar85._16_16_ = mm_lookupmask_ps._240_16_;
  auVar85._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
  uVar56 = 1 << ((byte)k & 0x1f);
LAB_007a6195:
  if (uVar59 == 0) {
LAB_007a80b5:
    return uVar59 != 0;
  }
  lVar60 = 0;
  if (uVar59 != 0) {
    for (; (uVar59 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
    }
  }
  uVar58 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar58].ptr;
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar60 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var12 + uVar63 * (long)pvVar11);
  fVar149 = *pfVar1;
  fVar163 = pfVar1[1];
  fVar160 = pfVar1[2];
  fVar178 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar63 + 1) * (long)pvVar11);
  pfVar2 = (float *)(_Var12 + (uVar63 + 2) * (long)pvVar11);
  pfVar3 = (float *)(_Var12 + (long)pvVar11 * (uVar63 + 3));
  fVar161 = *pfVar3;
  fVar179 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar180 = pfVar3[3];
  lVar13 = *(long *)&pGVar9[1].time_range.upper;
  pfVar3 = (float *)(lVar13 + (long)p_Var10 * uVar63);
  fVar209 = *pfVar3;
  fVar220 = pfVar3[1];
  fVar221 = pfVar3[2];
  fVar222 = pfVar3[3];
  pfVar3 = (float *)(lVar13 + (long)p_Var10 * (uVar63 + 1));
  uVar66 = uVar59 - 1 & uVar59;
  pfVar4 = (float *)(lVar13 + (long)p_Var10 * (uVar63 + 2));
  lVar14 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  pfVar5 = (float *)(lVar13 + (long)p_Var10 * (uVar63 + 3));
  fVar92 = *pfVar5;
  fVar93 = pfVar5[1];
  fVar120 = pfVar5[2];
  fVar121 = pfVar5[3];
  if (((uVar66 != 0) && (uVar63 = uVar66 - 1 & uVar66, uVar63 != 0)) && (lVar13 = 0, uVar63 != 0)) {
    for (; (uVar63 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar144 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar250 = *pfVar4 * 0.0;
  fVar258 = pfVar4[1] * 0.0;
  fVar259 = pfVar4[2] * 0.0;
  fVar260 = pfVar4[3] * 0.0;
  fVar261 = fVar250 + fVar92 * 0.0;
  fVar269 = fVar258 + fVar93 * 0.0;
  fVar270 = fVar259 + fVar120 * 0.0;
  fVar271 = fVar260 + fVar121 * 0.0;
  fVar272 = *pfVar3 * 0.0;
  fVar275 = pfVar3[1] * 0.0;
  fVar276 = pfVar3[2] * 0.0;
  fVar277 = pfVar3[3] * 0.0;
  local_720._0_4_ = fVar209 + fVar272 + fVar261;
  local_720._4_4_ = fVar220 + fVar275 + fVar269;
  fStack_718 = fVar221 + fVar276 + fVar270;
  fStack_714 = fVar222 + fVar277 + fVar271;
  auVar125._0_4_ = fVar261 + *pfVar3 * 3.0;
  auVar125._4_4_ = fVar269 + pfVar3[1] * 3.0;
  auVar125._8_4_ = fVar270 + pfVar3[2] * 3.0;
  auVar125._12_4_ = fVar271 + pfVar3[3] * 3.0;
  auVar262._0_4_ = fVar209 * 3.0;
  auVar262._4_4_ = fVar220 * 3.0;
  auVar262._8_4_ = fVar221 * 3.0;
  auVar262._12_4_ = fVar222 * 3.0;
  auVar130 = vsubps_avx(auVar125,auVar262);
  fVar282 = *pfVar2 * 0.0;
  fVar286 = pfVar2[1] * 0.0;
  fVar287 = pfVar2[2] * 0.0;
  fVar288 = pfVar2[3] * 0.0;
  fVar261 = fVar282 + fVar161 * 0.0;
  fVar269 = fVar286 + fVar179 * 0.0;
  fVar270 = fVar287 + fVar162 * 0.0;
  fVar271 = fVar288 + fVar180 * 0.0;
  fVar290 = *pfVar1 * 0.0;
  fVar298 = pfVar1[1] * 0.0;
  fVar299 = pfVar1[2] * 0.0;
  fVar300 = pfVar1[3] * 0.0;
  auVar301._0_4_ = fVar290 + fVar261 + fVar149;
  auVar301._4_4_ = fVar298 + fVar269 + fVar163;
  auVar301._8_4_ = fVar299 + fVar270 + fVar160;
  auVar301._12_4_ = fVar300 + fVar271 + fVar178;
  auVar153._0_4_ = fVar261 + *pfVar1 * 3.0;
  auVar153._4_4_ = fVar269 + pfVar1[1] * 3.0;
  auVar153._8_4_ = fVar270 + pfVar1[2] * 3.0;
  auVar153._12_4_ = fVar271 + pfVar1[3] * 3.0;
  auVar263._0_4_ = fVar149 * 3.0;
  auVar263._4_4_ = fVar163 * 3.0;
  auVar263._8_4_ = fVar160 * 3.0;
  auVar263._12_4_ = fVar178 * 3.0;
  auVar264 = vsubps_avx(auVar153,auVar263);
  auVar165._0_4_ = fVar209 * 0.0;
  auVar165._4_4_ = fVar220 * 0.0;
  auVar165._8_4_ = fVar221 * 0.0;
  auVar165._12_4_ = fVar222 * 0.0;
  auVar154._0_4_ = auVar165._0_4_ + fVar272 + fVar250 + fVar92;
  auVar154._4_4_ = auVar165._4_4_ + fVar275 + fVar258 + fVar93;
  auVar154._8_4_ = auVar165._8_4_ + fVar276 + fVar259 + fVar120;
  auVar154._12_4_ = auVar165._12_4_ + fVar277 + fVar260 + fVar121;
  auVar236._0_4_ = fVar92 * 3.0;
  auVar236._4_4_ = fVar93 * 3.0;
  auVar236._8_4_ = fVar120 * 3.0;
  auVar236._12_4_ = fVar121 * 3.0;
  auVar224._0_4_ = *pfVar4 * 3.0;
  auVar224._4_4_ = pfVar4[1] * 3.0;
  auVar224._8_4_ = pfVar4[2] * 3.0;
  auVar224._12_4_ = pfVar4[3] * 3.0;
  auVar73 = vsubps_avx(auVar236,auVar224);
  auVar225._0_4_ = fVar272 + auVar73._0_4_;
  auVar225._4_4_ = fVar275 + auVar73._4_4_;
  auVar225._8_4_ = fVar276 + auVar73._8_4_;
  auVar225._12_4_ = fVar277 + auVar73._12_4_;
  auVar67 = vsubps_avx(auVar225,auVar165);
  auVar183._0_4_ = fVar149 * 0.0;
  auVar183._4_4_ = fVar163 * 0.0;
  auVar183._8_4_ = fVar160 * 0.0;
  auVar183._12_4_ = fVar178 * 0.0;
  auVar237._0_4_ = fVar290 + fVar282 + fVar161 + auVar183._0_4_;
  auVar237._4_4_ = fVar298 + fVar286 + fVar179 + auVar183._4_4_;
  auVar237._8_4_ = fVar299 + fVar287 + fVar162 + auVar183._8_4_;
  auVar237._12_4_ = fVar300 + fVar288 + fVar180 + auVar183._12_4_;
  auVar212._0_4_ = fVar161 * 3.0;
  auVar212._4_4_ = fVar179 * 3.0;
  auVar212._8_4_ = fVar162 * 3.0;
  auVar212._12_4_ = fVar180 * 3.0;
  auVar198._0_4_ = *pfVar2 * 3.0;
  auVar198._4_4_ = pfVar2[1] * 3.0;
  auVar198._8_4_ = pfVar2[2] * 3.0;
  auVar198._12_4_ = pfVar2[3] * 3.0;
  auVar73 = vsubps_avx(auVar212,auVar198);
  auVar199._0_4_ = fVar290 + auVar73._0_4_;
  auVar199._4_4_ = fVar298 + auVar73._4_4_;
  auVar199._8_4_ = fVar299 + auVar73._8_4_;
  auVar199._12_4_ = fVar300 + auVar73._12_4_;
  auVar68 = vsubps_avx(auVar199,auVar183);
  auVar73 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar201 = vshufps_avx(auVar301,auVar301,0xc9);
  fVar250 = auVar130._0_4_;
  auVar213._0_4_ = fVar250 * auVar201._0_4_;
  fVar258 = auVar130._4_4_;
  auVar213._4_4_ = fVar258 * auVar201._4_4_;
  fVar259 = auVar130._8_4_;
  auVar213._8_4_ = fVar259 * auVar201._8_4_;
  fVar260 = auVar130._12_4_;
  auVar213._12_4_ = fVar260 * auVar201._12_4_;
  auVar226._0_4_ = auVar301._0_4_ * auVar73._0_4_;
  auVar226._4_4_ = auVar301._4_4_ * auVar73._4_4_;
  auVar226._8_4_ = auVar301._8_4_ * auVar73._8_4_;
  auVar226._12_4_ = auVar301._12_4_ * auVar73._12_4_;
  auVar201 = vsubps_avx(auVar226,auVar213);
  auVar15 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar201 = vshufps_avx(auVar264,auVar264,0xc9);
  auVar214._0_4_ = fVar250 * auVar201._0_4_;
  auVar214._4_4_ = fVar258 * auVar201._4_4_;
  auVar214._8_4_ = fVar259 * auVar201._8_4_;
  auVar214._12_4_ = fVar260 * auVar201._12_4_;
  auVar184._0_4_ = auVar264._0_4_ * auVar73._0_4_;
  auVar184._4_4_ = auVar264._4_4_ * auVar73._4_4_;
  auVar184._8_4_ = auVar264._8_4_ * auVar73._8_4_;
  auVar184._12_4_ = auVar264._12_4_ * auVar73._12_4_;
  auVar73 = vsubps_avx(auVar184,auVar214);
  auVar264 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar201 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar73 = vshufps_avx(auVar237,auVar237,0xc9);
  fVar261 = auVar67._0_4_;
  auVar185._0_4_ = fVar261 * auVar73._0_4_;
  fVar269 = auVar67._4_4_;
  auVar185._4_4_ = fVar269 * auVar73._4_4_;
  fVar270 = auVar67._8_4_;
  auVar185._8_4_ = fVar270 * auVar73._8_4_;
  fVar271 = auVar67._12_4_;
  auVar185._12_4_ = fVar271 * auVar73._12_4_;
  auVar238._0_4_ = auVar237._0_4_ * auVar201._0_4_;
  auVar238._4_4_ = auVar237._4_4_ * auVar201._4_4_;
  auVar238._8_4_ = auVar237._8_4_ * auVar201._8_4_;
  auVar238._12_4_ = auVar237._12_4_ * auVar201._12_4_;
  auVar73 = vsubps_avx(auVar238,auVar185);
  auVar16 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar73 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar239._0_4_ = auVar73._0_4_ * fVar261;
  auVar239._4_4_ = auVar73._4_4_ * fVar269;
  auVar239._8_4_ = auVar73._8_4_ * fVar270;
  auVar239._12_4_ = auVar73._12_4_ * fVar271;
  auVar73 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar200._0_4_ = auVar201._0_4_ * auVar68._0_4_;
  auVar200._4_4_ = auVar201._4_4_ * auVar68._4_4_;
  auVar200._8_4_ = auVar201._8_4_ * auVar68._8_4_;
  auVar200._12_4_ = auVar201._12_4_ * auVar68._12_4_;
  auVar201 = vsubps_avx(auVar200,auVar239);
  auVar68 = vshufps_avx(auVar201,auVar201,0xc9);
  fVar161 = auVar73._0_4_;
  auVar122 = ZEXT416((uint)fVar161);
  auVar201 = vrsqrtss_avx(auVar122,auVar122);
  fVar149 = auVar201._0_4_;
  auVar201 = ZEXT416((uint)(fVar149 * 1.5 - fVar161 * 0.5 * fVar149 * fVar149 * fVar149));
  auVar100 = vshufps_avx(auVar201,auVar201,0);
  auVar201 = vdpps_avx(auVar15,auVar264,0x7f);
  fVar149 = auVar15._0_4_ * auVar100._0_4_;
  fVar163 = auVar15._4_4_ * auVar100._4_4_;
  fVar160 = auVar15._8_4_ * auVar100._8_4_;
  fVar178 = auVar15._12_4_ * auVar100._12_4_;
  auVar73 = vshufps_avx(auVar73,auVar73,0);
  auVar251._0_4_ = auVar264._0_4_ * auVar73._0_4_;
  auVar251._4_4_ = auVar264._4_4_ * auVar73._4_4_;
  auVar251._8_4_ = auVar264._8_4_ * auVar73._8_4_;
  auVar251._12_4_ = auVar264._12_4_ * auVar73._12_4_;
  auVar73 = vshufps_avx(auVar201,auVar201,0);
  auVar227._0_4_ = auVar15._0_4_ * auVar73._0_4_;
  auVar227._4_4_ = auVar15._4_4_ * auVar73._4_4_;
  auVar227._8_4_ = auVar15._8_4_ * auVar73._8_4_;
  auVar227._12_4_ = auVar15._12_4_ * auVar73._12_4_;
  auVar95 = vsubps_avx(auVar251,auVar227);
  auVar73 = vrcpss_avx(auVar122,auVar122);
  auVar73 = ZEXT416((uint)(auVar73._0_4_ * (2.0 - fVar161 * auVar73._0_4_)));
  auVar15 = vshufps_avx(auVar73,auVar73,0);
  auVar73 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar161 = auVar73._0_4_;
  auVar122 = ZEXT416((uint)fVar161);
  auVar201 = vrsqrtss_avx(auVar122,auVar122);
  fVar179 = auVar201._0_4_;
  auVar201 = vdpps_avx(auVar16,auVar68,0x7f);
  auVar264 = ZEXT416((uint)(fVar179 * 1.5 - fVar161 * 0.5 * fVar179 * fVar179 * fVar179));
  auVar264 = vshufps_avx(auVar264,auVar264,0);
  fVar179 = auVar264._0_4_ * auVar16._0_4_;
  fVar162 = auVar264._4_4_ * auVar16._4_4_;
  fVar180 = auVar264._8_4_ * auVar16._8_4_;
  fVar209 = auVar264._12_4_ * auVar16._12_4_;
  auVar73 = vshufps_avx(auVar73,auVar73,0);
  auVar215._0_4_ = auVar73._0_4_ * auVar68._0_4_;
  auVar215._4_4_ = auVar73._4_4_ * auVar68._4_4_;
  auVar215._8_4_ = auVar73._8_4_ * auVar68._8_4_;
  auVar215._12_4_ = auVar73._12_4_ * auVar68._12_4_;
  auVar73 = vshufps_avx(auVar201,auVar201,0);
  auVar186._0_4_ = auVar73._0_4_ * auVar16._0_4_;
  auVar186._4_4_ = auVar73._4_4_ * auVar16._4_4_;
  auVar186._8_4_ = auVar73._8_4_ * auVar16._8_4_;
  auVar186._12_4_ = auVar73._12_4_ * auVar16._12_4_;
  auVar68 = vsubps_avx(auVar215,auVar186);
  auVar73 = vrcpss_avx(auVar122,auVar122);
  auVar73 = ZEXT416((uint)((2.0 - fVar161 * auVar73._0_4_) * auVar73._0_4_));
  auVar73 = vshufps_avx(auVar73,auVar73,0);
  auVar201 = vshufps_avx(_local_720,_local_720,0xff);
  auVar240._0_4_ = auVar201._0_4_ * fVar149;
  auVar240._4_4_ = auVar201._4_4_ * fVar163;
  auVar240._8_4_ = auVar201._8_4_ * fVar160;
  auVar240._12_4_ = auVar201._12_4_ * fVar178;
  _local_4d0 = vsubps_avx(_local_720,auVar240);
  auVar16 = vshufps_avx(auVar130,auVar130,0xff);
  auVar202._0_4_ =
       auVar16._0_4_ * fVar149 + auVar100._0_4_ * auVar95._0_4_ * auVar15._0_4_ * auVar201._0_4_;
  auVar202._4_4_ =
       auVar16._4_4_ * fVar163 + auVar100._4_4_ * auVar95._4_4_ * auVar15._4_4_ * auVar201._4_4_;
  auVar202._8_4_ =
       auVar16._8_4_ * fVar160 + auVar100._8_4_ * auVar95._8_4_ * auVar15._8_4_ * auVar201._8_4_;
  auVar202._12_4_ =
       auVar16._12_4_ * fVar178 +
       auVar100._12_4_ * auVar95._12_4_ * auVar15._12_4_ * auVar201._12_4_;
  auVar16 = vsubps_avx(auVar130,auVar202);
  local_4e0._0_4_ = auVar240._0_4_ + (float)local_720._0_4_;
  local_4e0._4_4_ = auVar240._4_4_ + (float)local_720._4_4_;
  fStack_4d8 = auVar240._8_4_ + fStack_718;
  fStack_4d4 = auVar240._12_4_ + fStack_714;
  auVar201 = vshufps_avx(auVar154,auVar154,0xff);
  auVar126._0_4_ = fVar179 * auVar201._0_4_;
  auVar126._4_4_ = fVar162 * auVar201._4_4_;
  auVar126._8_4_ = fVar180 * auVar201._8_4_;
  auVar126._12_4_ = fVar209 * auVar201._12_4_;
  _local_4f0 = vsubps_avx(auVar154,auVar126);
  auVar15 = vshufps_avx(auVar67,auVar67,0xff);
  auVar96._0_4_ =
       fVar179 * auVar15._0_4_ + auVar201._0_4_ * auVar264._0_4_ * auVar68._0_4_ * auVar73._0_4_;
  auVar96._4_4_ =
       fVar162 * auVar15._4_4_ + auVar201._4_4_ * auVar264._4_4_ * auVar68._4_4_ * auVar73._4_4_;
  auVar96._8_4_ =
       fVar180 * auVar15._8_4_ + auVar201._8_4_ * auVar264._8_4_ * auVar68._8_4_ * auVar73._8_4_;
  auVar96._12_4_ =
       fVar209 * auVar15._12_4_ +
       auVar201._12_4_ * auVar264._12_4_ * auVar68._12_4_ * auVar73._12_4_;
  auVar264 = vsubps_avx(auVar67,auVar96);
  local_500._0_4_ = auVar154._0_4_ + auVar126._0_4_;
  local_500._4_4_ = auVar154._4_4_ + auVar126._4_4_;
  fStack_4f8 = auVar154._8_4_ + auVar126._8_4_;
  fStack_4f4 = auVar154._12_4_ + auVar126._12_4_;
  local_510._0_4_ = local_4d0._0_4_ + auVar16._0_4_ * 0.33333334;
  local_510._4_4_ = local_4d0._4_4_ + auVar16._4_4_ * 0.33333334;
  fStack_508 = local_4d0._8_4_ + auVar16._8_4_ * 0.33333334;
  fStack_504 = local_4d0._12_4_ + auVar16._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx(_local_4d0,auVar144);
  auVar201 = vmovsldup_avx(local_3a0);
  auVar73 = vmovshdup_avx(local_3a0);
  auVar15 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar149 = pre->ray_space[k].vx.field_0.m128[0];
  fVar163 = pre->ray_space[k].vx.field_0.m128[1];
  fVar160 = pre->ray_space[k].vx.field_0.m128[2];
  fVar178 = pre->ray_space[k].vx.field_0.m128[3];
  fVar161 = pre->ray_space[k].vy.field_0.m128[0];
  fVar179 = pre->ray_space[k].vy.field_0.m128[1];
  fVar162 = pre->ray_space[k].vy.field_0.m128[2];
  fVar180 = pre->ray_space[k].vy.field_0.m128[3];
  fVar209 = pre->ray_space[k].vz.field_0.m128[0];
  fVar220 = pre->ray_space[k].vz.field_0.m128[1];
  fVar221 = pre->ray_space[k].vz.field_0.m128[2];
  fVar222 = pre->ray_space[k].vz.field_0.m128[3];
  fVar92 = fVar149 * auVar201._0_4_ + auVar15._0_4_ * fVar209 + fVar161 * auVar73._0_4_;
  fVar120 = fVar163 * auVar201._4_4_ + auVar15._4_4_ * fVar220 + fVar179 * auVar73._4_4_;
  local_720._4_4_ = fVar120;
  local_720._0_4_ = fVar92;
  fStack_718 = fVar160 * auVar201._8_4_ + auVar15._8_4_ * fVar221 + fVar162 * auVar73._8_4_;
  fStack_714 = fVar178 * auVar201._12_4_ + auVar15._12_4_ * fVar222 + fVar180 * auVar73._12_4_;
  local_3b0 = vsubps_avx(_local_510,auVar144);
  auVar15 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar73 = vmovshdup_avx(local_3b0);
  auVar201 = vmovsldup_avx(local_3b0);
  fVar93 = auVar201._0_4_ * fVar149 + auVar73._0_4_ * fVar161 + fVar209 * auVar15._0_4_;
  fVar121 = auVar201._4_4_ * fVar163 + auVar73._4_4_ * fVar179 + fVar220 * auVar15._4_4_;
  local_6d0._4_4_ = fVar121;
  local_6d0._0_4_ = fVar93;
  fStack_6c8 = auVar201._8_4_ * fVar160 + auVar73._8_4_ * fVar162 + fVar221 * auVar15._8_4_;
  fStack_6c4 = auVar201._12_4_ * fVar178 + auVar73._12_4_ * fVar180 + fVar222 * auVar15._12_4_;
  auVar187._0_4_ = auVar264._0_4_ * 0.33333334;
  auVar187._4_4_ = auVar264._4_4_ * 0.33333334;
  auVar187._8_4_ = auVar264._8_4_ * 0.33333334;
  auVar187._12_4_ = auVar264._12_4_ * 0.33333334;
  _local_520 = vsubps_avx(_local_4f0,auVar187);
  local_3c0 = vsubps_avx(_local_520,auVar144);
  auVar15 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar73 = vmovshdup_avx(local_3c0);
  auVar201 = vmovsldup_avx(local_3c0);
  auVar291._0_4_ = auVar201._0_4_ * fVar149 + auVar73._0_4_ * fVar161 + fVar209 * auVar15._0_4_;
  auVar291._4_4_ = auVar201._4_4_ * fVar163 + auVar73._4_4_ * fVar179 + fVar220 * auVar15._4_4_;
  auVar291._8_4_ = auVar201._8_4_ * fVar160 + auVar73._8_4_ * fVar162 + fVar221 * auVar15._8_4_;
  auVar291._12_4_ = auVar201._12_4_ * fVar178 + auVar73._12_4_ * fVar180 + fVar222 * auVar15._12_4_;
  local_3d0 = vsubps_avx(_local_4f0,auVar144);
  auVar15 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar73 = vmovshdup_avx(local_3d0);
  auVar201 = vmovsldup_avx(local_3d0);
  auVar284._0_4_ = auVar201._0_4_ * fVar149 + auVar73._0_4_ * fVar161 + auVar15._0_4_ * fVar209;
  auVar284._4_4_ = auVar201._4_4_ * fVar163 + auVar73._4_4_ * fVar179 + auVar15._4_4_ * fVar220;
  auVar284._8_4_ = auVar201._8_4_ * fVar160 + auVar73._8_4_ * fVar162 + auVar15._8_4_ * fVar221;
  auVar284._12_4_ = auVar201._12_4_ * fVar178 + auVar73._12_4_ * fVar180 + auVar15._12_4_ * fVar222;
  local_3e0 = vsubps_avx(_local_4e0,auVar144);
  auVar15 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar73 = vmovshdup_avx(local_3e0);
  auVar201 = vmovsldup_avx(local_3e0);
  auVar252._0_4_ = auVar201._0_4_ * fVar149 + auVar73._0_4_ * fVar161 + auVar15._0_4_ * fVar209;
  auVar252._4_4_ = auVar201._4_4_ * fVar163 + auVar73._4_4_ * fVar179 + auVar15._4_4_ * fVar220;
  auVar252._8_4_ = auVar201._8_4_ * fVar160 + auVar73._8_4_ * fVar162 + auVar15._8_4_ * fVar221;
  auVar252._12_4_ = auVar201._12_4_ * fVar178 + auVar73._12_4_ * fVar180 + auVar15._12_4_ * fVar222;
  local_530._0_4_ = (float)local_4e0._0_4_ + (fVar250 + auVar202._0_4_) * 0.33333334;
  local_530._4_4_ = (float)local_4e0._4_4_ + (fVar258 + auVar202._4_4_) * 0.33333334;
  fStack_528 = fStack_4d8 + (fVar259 + auVar202._8_4_) * 0.33333334;
  fStack_524 = fStack_4d4 + (fVar260 + auVar202._12_4_) * 0.33333334;
  local_3f0 = vsubps_avx(_local_530,auVar144);
  auVar15 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar73 = vmovshdup_avx(local_3f0);
  auVar201 = vmovsldup_avx(local_3f0);
  auVar228._0_4_ = auVar201._0_4_ * fVar149 + auVar73._0_4_ * fVar161 + auVar15._0_4_ * fVar209;
  auVar228._4_4_ = auVar201._4_4_ * fVar163 + auVar73._4_4_ * fVar179 + auVar15._4_4_ * fVar220;
  auVar228._8_4_ = auVar201._8_4_ * fVar160 + auVar73._8_4_ * fVar162 + auVar15._8_4_ * fVar221;
  auVar228._12_4_ = auVar201._12_4_ * fVar178 + auVar73._12_4_ * fVar180 + auVar15._12_4_ * fVar222;
  auVar216._0_4_ = (fVar261 + auVar96._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar269 + auVar96._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar270 + auVar96._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar271 + auVar96._12_4_) * 0.33333334;
  _local_440 = vsubps_avx(_local_500,auVar216);
  local_400 = vsubps_avx(_local_440,auVar144);
  auVar15 = vshufps_avx(local_400,local_400,0xaa);
  auVar73 = vmovshdup_avx(local_400);
  auVar201 = vmovsldup_avx(local_400);
  auVar241._0_4_ = auVar201._0_4_ * fVar149 + auVar73._0_4_ * fVar161 + fVar209 * auVar15._0_4_;
  auVar241._4_4_ = auVar201._4_4_ * fVar163 + auVar73._4_4_ * fVar179 + fVar220 * auVar15._4_4_;
  auVar241._8_4_ = auVar201._8_4_ * fVar160 + auVar73._8_4_ * fVar162 + fVar221 * auVar15._8_4_;
  auVar241._12_4_ = auVar201._12_4_ * fVar178 + auVar73._12_4_ * fVar180 + fVar222 * auVar15._12_4_;
  local_410 = vsubps_avx(_local_500,auVar144);
  auVar144 = vshufps_avx(local_410,local_410,0xaa);
  auVar73 = vmovshdup_avx(local_410);
  auVar201 = vmovsldup_avx(local_410);
  auVar97._0_4_ = fVar149 * auVar201._0_4_ + fVar161 * auVar73._0_4_ + fVar209 * auVar144._0_4_;
  auVar97._4_4_ = fVar163 * auVar201._4_4_ + fVar179 * auVar73._4_4_ + fVar220 * auVar144._4_4_;
  auVar97._8_4_ = fVar160 * auVar201._8_4_ + fVar162 * auVar73._8_4_ + fVar221 * auVar144._8_4_;
  auVar97._12_4_ = fVar178 * auVar201._12_4_ + fVar180 * auVar73._12_4_ + fVar222 * auVar144._12_4_;
  auVar15 = vmovlhps_avx(_local_720,auVar252);
  auVar264 = vmovlhps_avx(_local_6d0,auVar228);
  auVar16 = vmovlhps_avx(auVar291,auVar241);
  _local_380 = vmovlhps_avx(auVar284,auVar97);
  auVar73 = vminps_avx(auVar15,auVar264);
  auVar201 = vminps_avx(auVar16,_local_380);
  auVar144 = vminps_avx(auVar73,auVar201);
  auVar73 = vmaxps_avx(auVar15,auVar264);
  auVar201 = vmaxps_avx(auVar16,_local_380);
  auVar73 = vmaxps_avx(auVar73,auVar201);
  auVar201 = vshufpd_avx(auVar144,auVar144,3);
  auVar144 = vminps_avx(auVar144,auVar201);
  auVar201 = vshufpd_avx(auVar73,auVar73,3);
  auVar201 = vmaxps_avx(auVar73,auVar201);
  auVar203._8_4_ = 0x7fffffff;
  auVar203._0_8_ = 0x7fffffff7fffffff;
  auVar203._12_4_ = 0x7fffffff;
  auVar73 = vandps_avx(auVar144,auVar203);
  auVar201 = vandps_avx(auVar201,auVar203);
  auVar73 = vmaxps_avx(auVar73,auVar201);
  auVar201 = vmovshdup_avx(auVar73);
  auVar73 = vmaxss_avx(auVar201,auVar73);
  fVar149 = auVar73._0_4_ * 9.536743e-07;
  local_390 = ZEXT416((uint)fVar149);
  auVar73 = vshufps_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),0);
  local_1c0._16_16_ = auVar73;
  local_1c0._0_16_ = auVar73;
  auVar69._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
  auVar69._8_4_ = auVar73._8_4_ ^ 0x80000000;
  auVar69._12_4_ = auVar73._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar69;
  local_1e0._0_16_ = auVar69;
  auVar73 = vpshufd_avx(ZEXT416(uVar58),0);
  local_300._16_16_ = auVar73;
  local_300._0_16_ = auVar73;
  auVar73 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar60 * 4 + 6)),0);
  local_320._16_16_ = auVar73;
  local_320._0_16_ = auVar73;
  bVar65 = false;
  uVar63 = 0;
  fVar149 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar264,auVar15);
  _local_360 = vsubps_avx(auVar16,auVar264);
  _local_370 = vsubps_avx(_local_380,auVar16);
  _local_450 = vsubps_avx(_local_4e0,_local_4d0);
  _local_460 = vsubps_avx(_local_530,_local_510);
  _local_470 = vsubps_avx(_local_440,_local_520);
  _local_480 = vsubps_avx(_local_500,_local_4f0);
  auVar297 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar303 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_007a69cb:
  local_420 = auVar303._0_16_;
  auVar123 = auVar297._0_16_;
  auVar73 = vshufps_avx(auVar123,auVar123,0x50);
  auVar292._8_4_ = 0x3f800000;
  auVar292._0_8_ = 0x3f8000003f800000;
  auVar292._12_4_ = 0x3f800000;
  auVar296._16_4_ = 0x3f800000;
  auVar296._0_16_ = auVar292;
  auVar296._20_4_ = 0x3f800000;
  auVar296._24_4_ = 0x3f800000;
  auVar296._28_4_ = 0x3f800000;
  auVar201 = vsubps_avx(auVar292,auVar73);
  fVar163 = auVar73._0_4_;
  fVar160 = auVar73._4_4_;
  fVar178 = auVar73._8_4_;
  fVar161 = auVar73._12_4_;
  fVar179 = auVar201._0_4_;
  fVar162 = auVar201._4_4_;
  fVar180 = auVar201._8_4_;
  fVar209 = auVar201._12_4_;
  auVar155._0_4_ = auVar252._0_4_ * fVar163 + fVar179 * fVar92;
  auVar155._4_4_ = auVar252._4_4_ * fVar160 + fVar162 * fVar120;
  auVar155._8_4_ = auVar252._0_4_ * fVar178 + fVar180 * fVar92;
  auVar155._12_4_ = auVar252._4_4_ * fVar161 + fVar209 * fVar120;
  auVar127._0_4_ = auVar228._0_4_ * fVar163 + fVar179 * fVar93;
  auVar127._4_4_ = auVar228._4_4_ * fVar160 + fVar162 * fVar121;
  auVar127._8_4_ = auVar228._0_4_ * fVar178 + fVar180 * fVar93;
  auVar127._12_4_ = auVar228._4_4_ * fVar161 + fVar209 * fVar121;
  auVar217._0_4_ = auVar241._0_4_ * fVar163 + auVar291._0_4_ * fVar179;
  auVar217._4_4_ = auVar241._4_4_ * fVar160 + auVar291._4_4_ * fVar162;
  auVar217._8_4_ = auVar241._0_4_ * fVar178 + auVar291._0_4_ * fVar180;
  auVar217._12_4_ = auVar241._4_4_ * fVar161 + auVar291._4_4_ * fVar209;
  auVar166._0_4_ = auVar97._0_4_ * fVar163 + auVar284._0_4_ * fVar179;
  auVar166._4_4_ = auVar97._4_4_ * fVar160 + auVar284._4_4_ * fVar162;
  auVar166._8_4_ = auVar97._0_4_ * fVar178 + auVar284._0_4_ * fVar180;
  auVar166._12_4_ = auVar97._4_4_ * fVar161 + auVar284._4_4_ * fVar209;
  auVar73 = vmovshdup_avx(local_420);
  auVar201 = vshufps_avx(local_420,local_420,0);
  auVar244._16_16_ = auVar201;
  auVar244._0_16_ = auVar201;
  auVar144 = vshufps_avx(local_420,local_420,0x55);
  auVar86._16_16_ = auVar144;
  auVar86._0_16_ = auVar144;
  auVar85 = vsubps_avx(auVar86,auVar244);
  auVar144 = vshufps_avx(auVar155,auVar155,0);
  auVar68 = vshufps_avx(auVar155,auVar155,0x55);
  auVar100 = vshufps_avx(auVar127,auVar127,0);
  auVar130 = vshufps_avx(auVar127,auVar127,0x55);
  auVar67 = vshufps_avx(auVar217,auVar217,0);
  auVar95 = vshufps_avx(auVar217,auVar217,0x55);
  auVar122 = vshufps_avx(auVar166,auVar166,0);
  auVar94 = vshufps_avx(auVar166,auVar166,0x55);
  auVar73 = ZEXT416((uint)((auVar73._0_4_ - auVar303._0_4_) * 0.04761905));
  auVar73 = vshufps_avx(auVar73,auVar73,0);
  auVar257._0_4_ = auVar201._0_4_ + auVar85._0_4_ * 0.0;
  auVar257._4_4_ = auVar201._4_4_ + auVar85._4_4_ * 0.14285715;
  auVar257._8_4_ = auVar201._8_4_ + auVar85._8_4_ * 0.2857143;
  auVar257._12_4_ = auVar201._12_4_ + auVar85._12_4_ * 0.42857146;
  auVar257._16_4_ = auVar201._0_4_ + auVar85._16_4_ * 0.5714286;
  auVar257._20_4_ = auVar201._4_4_ + auVar85._20_4_ * 0.71428573;
  auVar257._24_4_ = auVar201._8_4_ + auVar85._24_4_ * 0.8571429;
  auVar257._28_4_ = auVar201._12_4_ + auVar85._28_4_;
  auVar17 = vsubps_avx(auVar296,auVar257);
  fVar163 = auVar100._0_4_;
  fVar178 = auVar100._4_4_;
  fVar179 = auVar100._8_4_;
  fVar180 = auVar100._12_4_;
  fVar298 = auVar17._0_4_;
  fVar299 = auVar17._4_4_;
  fVar300 = auVar17._8_4_;
  fVar246 = auVar17._12_4_;
  fVar247 = auVar17._16_4_;
  fVar248 = auVar17._20_4_;
  fVar249 = auVar17._24_4_;
  fVar275 = auVar130._0_4_;
  fVar277 = auVar130._4_4_;
  fVar286 = auVar130._8_4_;
  fVar288 = auVar130._12_4_;
  fVar289 = auVar68._12_4_ + 1.0;
  fVar269 = auVar67._0_4_;
  fVar270 = auVar67._4_4_;
  fVar271 = auVar67._8_4_;
  fVar272 = auVar67._12_4_;
  fVar220 = fVar269 * auVar257._0_4_ + fVar298 * fVar163;
  fVar221 = fVar270 * auVar257._4_4_ + fVar299 * fVar178;
  fVar222 = fVar271 * auVar257._8_4_ + fVar300 * fVar179;
  fVar250 = fVar272 * auVar257._12_4_ + fVar246 * fVar180;
  fVar258 = fVar269 * auVar257._16_4_ + fVar247 * fVar163;
  fVar259 = fVar270 * auVar257._20_4_ + fVar248 * fVar178;
  fVar260 = fVar271 * auVar257._24_4_ + fVar249 * fVar179;
  fVar160 = auVar95._0_4_;
  fVar161 = auVar95._4_4_;
  fVar162 = auVar95._8_4_;
  fVar209 = auVar95._12_4_;
  fVar276 = fVar275 * fVar298 + auVar257._0_4_ * fVar160;
  fVar282 = fVar277 * fVar299 + auVar257._4_4_ * fVar161;
  fVar287 = fVar286 * fVar300 + auVar257._8_4_ * fVar162;
  fVar290 = fVar288 * fVar246 + auVar257._12_4_ * fVar209;
  fVar278 = fVar275 * fVar247 + auVar257._16_4_ * fVar160;
  fVar279 = fVar277 * fVar248 + auVar257._20_4_ * fVar161;
  fVar280 = fVar286 * fVar249 + auVar257._24_4_ * fVar162;
  fVar281 = fVar288 + fVar180;
  auVar201 = vshufps_avx(auVar155,auVar155,0xaa);
  auVar100 = vshufps_avx(auVar155,auVar155,0xff);
  fVar261 = fVar272 + 0.0;
  auVar130 = vshufps_avx(auVar127,auVar127,0xaa);
  auVar67 = vshufps_avx(auVar127,auVar127,0xff);
  auVar176._0_4_ =
       fVar298 * (auVar257._0_4_ * fVar163 + fVar298 * auVar144._0_4_) + auVar257._0_4_ * fVar220;
  auVar176._4_4_ =
       fVar299 * (auVar257._4_4_ * fVar178 + fVar299 * auVar144._4_4_) + auVar257._4_4_ * fVar221;
  auVar176._8_4_ =
       fVar300 * (auVar257._8_4_ * fVar179 + fVar300 * auVar144._8_4_) + auVar257._8_4_ * fVar222;
  auVar176._12_4_ =
       fVar246 * (auVar257._12_4_ * fVar180 + fVar246 * auVar144._12_4_) + auVar257._12_4_ * fVar250
  ;
  auVar176._16_4_ =
       fVar247 * (auVar257._16_4_ * fVar163 + fVar247 * auVar144._0_4_) + auVar257._16_4_ * fVar258;
  auVar176._20_4_ =
       fVar248 * (auVar257._20_4_ * fVar178 + fVar248 * auVar144._4_4_) + auVar257._20_4_ * fVar259;
  auVar176._24_4_ =
       fVar249 * (auVar257._24_4_ * fVar179 + fVar249 * auVar144._8_4_) + auVar257._24_4_ * fVar260;
  auVar176._28_4_ = auVar144._12_4_ + 1.0 + fVar209;
  auVar194._0_4_ =
       fVar298 * (fVar275 * auVar257._0_4_ + auVar68._0_4_ * fVar298) + auVar257._0_4_ * fVar276;
  auVar194._4_4_ =
       fVar299 * (fVar277 * auVar257._4_4_ + auVar68._4_4_ * fVar299) + auVar257._4_4_ * fVar282;
  auVar194._8_4_ =
       fVar300 * (fVar286 * auVar257._8_4_ + auVar68._8_4_ * fVar300) + auVar257._8_4_ * fVar287;
  auVar194._12_4_ =
       fVar246 * (fVar288 * auVar257._12_4_ + auVar68._12_4_ * fVar246) + auVar257._12_4_ * fVar290;
  auVar194._16_4_ =
       fVar247 * (fVar275 * auVar257._16_4_ + auVar68._0_4_ * fVar247) + auVar257._16_4_ * fVar278;
  auVar194._20_4_ =
       fVar248 * (fVar277 * auVar257._20_4_ + auVar68._4_4_ * fVar248) + auVar257._20_4_ * fVar279;
  auVar194._24_4_ =
       fVar249 * (fVar286 * auVar257._24_4_ + auVar68._8_4_ * fVar249) + auVar257._24_4_ * fVar280;
  auVar194._28_4_ = auVar94._12_4_ + fVar209;
  auVar87._0_4_ =
       fVar298 * fVar220 + auVar257._0_4_ * (fVar269 * fVar298 + auVar122._0_4_ * auVar257._0_4_);
  auVar87._4_4_ =
       fVar299 * fVar221 + auVar257._4_4_ * (fVar270 * fVar299 + auVar122._4_4_ * auVar257._4_4_);
  auVar87._8_4_ =
       fVar300 * fVar222 + auVar257._8_4_ * (fVar271 * fVar300 + auVar122._8_4_ * auVar257._8_4_);
  auVar87._12_4_ =
       fVar246 * fVar250 + auVar257._12_4_ * (fVar272 * fVar246 + auVar122._12_4_ * auVar257._12_4_)
  ;
  auVar87._16_4_ =
       fVar247 * fVar258 + auVar257._16_4_ * (fVar269 * fVar247 + auVar122._0_4_ * auVar257._16_4_);
  auVar87._20_4_ =
       fVar248 * fVar259 + auVar257._20_4_ * (fVar270 * fVar248 + auVar122._4_4_ * auVar257._20_4_);
  auVar87._24_4_ =
       fVar249 * fVar260 + auVar257._24_4_ * (fVar271 * fVar249 + auVar122._8_4_ * auVar257._24_4_);
  auVar87._28_4_ = fVar180 + 1.0 + fVar261;
  auVar268._0_4_ =
       fVar298 * fVar276 + auVar257._0_4_ * (auVar94._0_4_ * auVar257._0_4_ + fVar298 * fVar160);
  auVar268._4_4_ =
       fVar299 * fVar282 + auVar257._4_4_ * (auVar94._4_4_ * auVar257._4_4_ + fVar299 * fVar161);
  auVar268._8_4_ =
       fVar300 * fVar287 + auVar257._8_4_ * (auVar94._8_4_ * auVar257._8_4_ + fVar300 * fVar162);
  auVar268._12_4_ =
       fVar246 * fVar290 + auVar257._12_4_ * (auVar94._12_4_ * auVar257._12_4_ + fVar246 * fVar209);
  auVar268._16_4_ =
       fVar247 * fVar278 + auVar257._16_4_ * (auVar94._0_4_ * auVar257._16_4_ + fVar247 * fVar160);
  auVar268._20_4_ =
       fVar248 * fVar279 + auVar257._20_4_ * (auVar94._4_4_ * auVar257._20_4_ + fVar248 * fVar161);
  auVar268._24_4_ =
       fVar249 * fVar280 + auVar257._24_4_ * (auVar94._8_4_ * auVar257._24_4_ + fVar249 * fVar162);
  auVar268._28_4_ = fVar261 + fVar209 + 0.0;
  local_220._0_4_ = fVar298 * auVar176._0_4_ + auVar257._0_4_ * auVar87._0_4_;
  local_220._4_4_ = fVar299 * auVar176._4_4_ + auVar257._4_4_ * auVar87._4_4_;
  local_220._8_4_ = fVar300 * auVar176._8_4_ + auVar257._8_4_ * auVar87._8_4_;
  local_220._12_4_ = fVar246 * auVar176._12_4_ + auVar257._12_4_ * auVar87._12_4_;
  local_220._16_4_ = fVar247 * auVar176._16_4_ + auVar257._16_4_ * auVar87._16_4_;
  local_220._20_4_ = fVar248 * auVar176._20_4_ + auVar257._20_4_ * auVar87._20_4_;
  local_220._24_4_ = fVar249 * auVar176._24_4_ + auVar257._24_4_ * auVar87._24_4_;
  local_220._28_4_ = fVar281 + fVar209 + 0.0;
  auVar159._0_4_ = fVar298 * auVar194._0_4_ + auVar257._0_4_ * auVar268._0_4_;
  auVar159._4_4_ = fVar299 * auVar194._4_4_ + auVar257._4_4_ * auVar268._4_4_;
  auVar159._8_4_ = fVar300 * auVar194._8_4_ + auVar257._8_4_ * auVar268._8_4_;
  auVar159._12_4_ = fVar246 * auVar194._12_4_ + auVar257._12_4_ * auVar268._12_4_;
  auVar159._16_4_ = fVar247 * auVar194._16_4_ + auVar257._16_4_ * auVar268._16_4_;
  auVar159._20_4_ = fVar248 * auVar194._20_4_ + auVar257._20_4_ * auVar268._20_4_;
  auVar159._24_4_ = fVar249 * auVar194._24_4_ + auVar257._24_4_ * auVar268._24_4_;
  auVar159._28_4_ = fVar281 + fVar261;
  auVar18 = vsubps_avx(auVar87,auVar176);
  auVar85 = vsubps_avx(auVar268,auVar194);
  local_660 = auVar73._0_4_;
  fStack_65c = auVar73._4_4_;
  fStack_658 = auVar73._8_4_;
  fStack_654 = auVar73._12_4_;
  local_260 = local_660 * auVar18._0_4_ * 3.0;
  fStack_25c = fStack_65c * auVar18._4_4_ * 3.0;
  auVar19._4_4_ = fStack_25c;
  auVar19._0_4_ = local_260;
  fStack_258 = fStack_658 * auVar18._8_4_ * 3.0;
  auVar19._8_4_ = fStack_258;
  fStack_254 = fStack_654 * auVar18._12_4_ * 3.0;
  auVar19._12_4_ = fStack_254;
  fStack_250 = local_660 * auVar18._16_4_ * 3.0;
  auVar19._16_4_ = fStack_250;
  fStack_24c = fStack_65c * auVar18._20_4_ * 3.0;
  auVar19._20_4_ = fStack_24c;
  fStack_248 = fStack_658 * auVar18._24_4_ * 3.0;
  auVar19._24_4_ = fStack_248;
  auVar19._28_4_ = auVar18._28_4_;
  local_280 = local_660 * auVar85._0_4_ * 3.0;
  fStack_27c = fStack_65c * auVar85._4_4_ * 3.0;
  auVar20._4_4_ = fStack_27c;
  auVar20._0_4_ = local_280;
  fStack_278 = fStack_658 * auVar85._8_4_ * 3.0;
  auVar20._8_4_ = fStack_278;
  fStack_274 = fStack_654 * auVar85._12_4_ * 3.0;
  auVar20._12_4_ = fStack_274;
  fStack_270 = local_660 * auVar85._16_4_ * 3.0;
  auVar20._16_4_ = fStack_270;
  fStack_26c = fStack_65c * auVar85._20_4_ * 3.0;
  auVar20._20_4_ = fStack_26c;
  fStack_268 = fStack_658 * auVar85._24_4_ * 3.0;
  auVar20._24_4_ = fStack_268;
  auVar20._28_4_ = fVar281;
  auVar19 = vsubps_avx(local_220,auVar19);
  auVar85 = vperm2f128_avx(auVar19,auVar19,1);
  auVar85 = vshufps_avx(auVar85,auVar19,0x30);
  auVar85 = vshufps_avx(auVar19,auVar85,0x29);
  auVar20 = vsubps_avx(auVar159,auVar20);
  auVar19 = vperm2f128_avx(auVar20,auVar20,1);
  auVar19 = vshufps_avx(auVar19,auVar20,0x30);
  auVar20 = vshufps_avx(auVar20,auVar19,0x29);
  fVar279 = auVar130._0_4_;
  fVar280 = auVar130._4_4_;
  fVar304 = auVar130._8_4_;
  fVar180 = auVar201._12_4_;
  fVar270 = auVar67._0_4_;
  fVar272 = auVar67._4_4_;
  fVar276 = auVar67._8_4_;
  fVar282 = auVar67._12_4_;
  auVar73 = vshufps_avx(auVar217,auVar217,0xaa);
  fVar163 = auVar73._0_4_;
  fVar178 = auVar73._4_4_;
  fVar179 = auVar73._8_4_;
  fVar209 = auVar73._12_4_;
  fVar222 = auVar257._0_4_ * fVar163 + fVar279 * fVar298;
  fVar250 = auVar257._4_4_ * fVar178 + fVar280 * fVar299;
  fVar258 = auVar257._8_4_ * fVar179 + fVar304 * fVar300;
  fVar259 = auVar257._12_4_ * fVar209 + auVar130._12_4_ * fVar246;
  fVar260 = auVar257._16_4_ * fVar163 + fVar279 * fVar247;
  fVar261 = auVar257._20_4_ * fVar178 + fVar280 * fVar248;
  fVar269 = auVar257._24_4_ * fVar179 + fVar304 * fVar249;
  auVar73 = vshufps_avx(auVar217,auVar217,0xff);
  fVar160 = auVar73._0_4_;
  fVar161 = auVar73._4_4_;
  fVar162 = auVar73._8_4_;
  fVar220 = auVar73._12_4_;
  fVar271 = auVar257._0_4_ * fVar160 + fVar270 * fVar298;
  fVar275 = auVar257._4_4_ * fVar161 + fVar272 * fVar299;
  fVar277 = auVar257._8_4_ * fVar162 + fVar276 * fVar300;
  fVar286 = auVar257._12_4_ * fVar220 + fVar282 * fVar246;
  fVar287 = auVar257._16_4_ * fVar160 + fVar270 * fVar247;
  fVar288 = auVar257._20_4_ * fVar161 + fVar272 * fVar248;
  fVar290 = auVar257._24_4_ * fVar162 + fVar276 * fVar249;
  auVar73 = vshufps_avx(auVar166,auVar166,0xaa);
  fVar278 = auVar73._12_4_ + fVar209;
  auVar144 = vshufps_avx(auVar166,auVar166,0xff);
  fVar221 = auVar144._12_4_;
  auVar88._0_4_ =
       fVar298 * (fVar279 * auVar257._0_4_ + fVar298 * auVar201._0_4_) + auVar257._0_4_ * fVar222;
  auVar88._4_4_ =
       fVar299 * (fVar280 * auVar257._4_4_ + fVar299 * auVar201._4_4_) + auVar257._4_4_ * fVar250;
  auVar88._8_4_ =
       fVar300 * (fVar304 * auVar257._8_4_ + fVar300 * auVar201._8_4_) + auVar257._8_4_ * fVar258;
  auVar88._12_4_ =
       fVar246 * (auVar130._12_4_ * auVar257._12_4_ + fVar246 * fVar180) + auVar257._12_4_ * fVar259
  ;
  auVar88._16_4_ =
       fVar247 * (fVar279 * auVar257._16_4_ + fVar247 * auVar201._0_4_) + auVar257._16_4_ * fVar260;
  auVar88._20_4_ =
       fVar248 * (fVar280 * auVar257._20_4_ + fVar248 * auVar201._4_4_) + auVar257._20_4_ * fVar261;
  auVar88._24_4_ =
       fVar249 * (fVar304 * auVar257._24_4_ + fVar249 * auVar201._8_4_) + auVar257._24_4_ * fVar269;
  auVar88._28_4_ = auVar20._28_4_ + fVar180 + fVar221;
  auVar115._0_4_ =
       fVar298 * (fVar270 * auVar257._0_4_ + auVar100._0_4_ * fVar298) + auVar257._0_4_ * fVar271;
  auVar115._4_4_ =
       fVar299 * (fVar272 * auVar257._4_4_ + auVar100._4_4_ * fVar299) + auVar257._4_4_ * fVar275;
  auVar115._8_4_ =
       fVar300 * (fVar276 * auVar257._8_4_ + auVar100._8_4_ * fVar300) + auVar257._8_4_ * fVar277;
  auVar115._12_4_ =
       fVar246 * (fVar282 * auVar257._12_4_ + auVar100._12_4_ * fVar246) + auVar257._12_4_ * fVar286
  ;
  auVar115._16_4_ =
       fVar247 * (fVar270 * auVar257._16_4_ + auVar100._0_4_ * fVar247) + auVar257._16_4_ * fVar287;
  auVar115._20_4_ =
       fVar248 * (fVar272 * auVar257._20_4_ + auVar100._4_4_ * fVar248) + auVar257._20_4_ * fVar288;
  auVar115._24_4_ =
       fVar249 * (fVar276 * auVar257._24_4_ + auVar100._8_4_ * fVar249) + auVar257._24_4_ * fVar290;
  auVar115._28_4_ = fVar180 + auVar19._28_4_ + fVar221;
  auVar19 = vperm2f128_avx(local_220,local_220,1);
  auVar19 = vshufps_avx(auVar19,local_220,0x30);
  _local_560 = vshufps_avx(local_220,auVar19,0x29);
  auVar195._0_4_ =
       auVar257._0_4_ * (auVar73._0_4_ * auVar257._0_4_ + fVar298 * fVar163) + fVar298 * fVar222;
  auVar195._4_4_ =
       auVar257._4_4_ * (auVar73._4_4_ * auVar257._4_4_ + fVar299 * fVar178) + fVar299 * fVar250;
  auVar195._8_4_ =
       auVar257._8_4_ * (auVar73._8_4_ * auVar257._8_4_ + fVar300 * fVar179) + fVar300 * fVar258;
  auVar195._12_4_ =
       auVar257._12_4_ * (auVar73._12_4_ * auVar257._12_4_ + fVar246 * fVar209) + fVar246 * fVar259;
  auVar195._16_4_ =
       auVar257._16_4_ * (auVar73._0_4_ * auVar257._16_4_ + fVar247 * fVar163) + fVar247 * fVar260;
  auVar195._20_4_ =
       auVar257._20_4_ * (auVar73._4_4_ * auVar257._20_4_ + fVar248 * fVar178) + fVar248 * fVar261;
  auVar195._24_4_ =
       auVar257._24_4_ * (auVar73._8_4_ * auVar257._24_4_ + fVar249 * fVar179) + fVar249 * fVar269;
  auVar195._28_4_ = fVar278 + fVar289 + auVar194._28_4_;
  auVar234._0_4_ =
       fVar298 * fVar271 + auVar257._0_4_ * (auVar257._0_4_ * auVar144._0_4_ + fVar298 * fVar160);
  auVar234._4_4_ =
       fVar299 * fVar275 + auVar257._4_4_ * (auVar257._4_4_ * auVar144._4_4_ + fVar299 * fVar161);
  auVar234._8_4_ =
       fVar300 * fVar277 + auVar257._8_4_ * (auVar257._8_4_ * auVar144._8_4_ + fVar300 * fVar162);
  auVar234._12_4_ =
       fVar246 * fVar286 + auVar257._12_4_ * (auVar257._12_4_ * fVar221 + fVar246 * fVar220);
  auVar234._16_4_ =
       fVar247 * fVar287 + auVar257._16_4_ * (auVar257._16_4_ * auVar144._0_4_ + fVar247 * fVar160);
  auVar234._20_4_ =
       fVar248 * fVar288 + auVar257._20_4_ * (auVar257._20_4_ * auVar144._4_4_ + fVar248 * fVar161);
  auVar234._24_4_ =
       fVar249 * fVar290 + auVar257._24_4_ * (auVar257._24_4_ * auVar144._8_4_ + fVar249 * fVar162);
  auVar234._28_4_ = fVar289 + fVar282 + fVar221 + fVar220;
  auVar219._0_4_ = fVar298 * auVar88._0_4_ + auVar257._0_4_ * auVar195._0_4_;
  auVar219._4_4_ = fVar299 * auVar88._4_4_ + auVar257._4_4_ * auVar195._4_4_;
  auVar219._8_4_ = fVar300 * auVar88._8_4_ + auVar257._8_4_ * auVar195._8_4_;
  auVar219._12_4_ = fVar246 * auVar88._12_4_ + auVar257._12_4_ * auVar195._12_4_;
  auVar219._16_4_ = fVar247 * auVar88._16_4_ + auVar257._16_4_ * auVar195._16_4_;
  auVar219._20_4_ = fVar248 * auVar88._20_4_ + auVar257._20_4_ * auVar195._20_4_;
  auVar219._24_4_ = fVar249 * auVar88._24_4_ + auVar257._24_4_ * auVar195._24_4_;
  auVar219._28_4_ = fVar278 + fVar221 + fVar220;
  auVar245._0_4_ = fVar298 * auVar115._0_4_ + auVar257._0_4_ * auVar234._0_4_;
  auVar245._4_4_ = fVar299 * auVar115._4_4_ + auVar257._4_4_ * auVar234._4_4_;
  auVar245._8_4_ = fVar300 * auVar115._8_4_ + auVar257._8_4_ * auVar234._8_4_;
  auVar245._12_4_ = fVar246 * auVar115._12_4_ + auVar257._12_4_ * auVar234._12_4_;
  auVar245._16_4_ = fVar247 * auVar115._16_4_ + auVar257._16_4_ * auVar234._16_4_;
  auVar245._20_4_ = fVar248 * auVar115._20_4_ + auVar257._20_4_ * auVar234._20_4_;
  auVar245._24_4_ = fVar249 * auVar115._24_4_ + auVar257._24_4_ * auVar234._24_4_;
  auVar245._28_4_ = auVar17._28_4_ + auVar257._28_4_;
  auVar21 = vsubps_avx(auVar195,auVar88);
  auVar19 = vsubps_avx(auVar234,auVar115);
  local_2a0 = local_660 * auVar21._0_4_ * 3.0;
  fStack_29c = fStack_65c * auVar21._4_4_ * 3.0;
  auVar17._4_4_ = fStack_29c;
  auVar17._0_4_ = local_2a0;
  fStack_298 = fStack_658 * auVar21._8_4_ * 3.0;
  auVar17._8_4_ = fStack_298;
  fStack_294 = fStack_654 * auVar21._12_4_ * 3.0;
  auVar17._12_4_ = fStack_294;
  fStack_290 = local_660 * auVar21._16_4_ * 3.0;
  auVar17._16_4_ = fStack_290;
  fStack_28c = fStack_65c * auVar21._20_4_ * 3.0;
  auVar17._20_4_ = fStack_28c;
  fStack_288 = fStack_658 * auVar21._24_4_ * 3.0;
  auVar17._24_4_ = fStack_288;
  auVar17._28_4_ = auVar21._28_4_;
  local_2c0 = local_660 * auVar19._0_4_ * 3.0;
  fStack_2bc = fStack_65c * auVar19._4_4_ * 3.0;
  auVar22._4_4_ = fStack_2bc;
  auVar22._0_4_ = local_2c0;
  fStack_2b8 = fStack_658 * auVar19._8_4_ * 3.0;
  auVar22._8_4_ = fStack_2b8;
  fStack_2b4 = fStack_654 * auVar19._12_4_ * 3.0;
  auVar22._12_4_ = fStack_2b4;
  fStack_2b0 = local_660 * auVar19._16_4_ * 3.0;
  auVar22._16_4_ = fStack_2b0;
  fStack_2ac = fStack_65c * auVar19._20_4_ * 3.0;
  auVar22._20_4_ = fStack_2ac;
  fStack_2a8 = fStack_658 * auVar19._24_4_ * 3.0;
  auVar22._24_4_ = fStack_2a8;
  auVar22._28_4_ = auVar195._28_4_;
  auVar19 = vperm2f128_avx(auVar219,auVar219,1);
  auVar19 = vshufps_avx(auVar19,auVar219,0x30);
  auVar86 = vshufps_avx(auVar219,auVar19,0x29);
  auVar17 = vsubps_avx(auVar219,auVar17);
  auVar19 = vperm2f128_avx(auVar17,auVar17,1);
  auVar19 = vshufps_avx(auVar19,auVar17,0x30);
  auVar19 = vshufps_avx(auVar17,auVar19,0x29);
  auVar22 = vsubps_avx(auVar245,auVar22);
  auVar17 = vperm2f128_avx(auVar22,auVar22,1);
  auVar17 = vshufps_avx(auVar17,auVar22,0x30);
  local_200 = vshufps_avx(auVar22,auVar17,0x29);
  auVar23 = vsubps_avx(auVar219,local_220);
  auVar87 = vsubps_avx(auVar86,_local_560);
  fVar163 = auVar87._0_4_ + auVar23._0_4_;
  fVar160 = auVar87._4_4_ + auVar23._4_4_;
  fVar178 = auVar87._8_4_ + auVar23._8_4_;
  fVar161 = auVar87._12_4_ + auVar23._12_4_;
  fVar179 = auVar87._16_4_ + auVar23._16_4_;
  fVar162 = auVar87._20_4_ + auVar23._20_4_;
  fVar180 = auVar87._24_4_ + auVar23._24_4_;
  auVar17 = vperm2f128_avx(auVar159,auVar159,1);
  auVar17 = vshufps_avx(auVar17,auVar159,0x30);
  local_240 = vshufps_avx(auVar159,auVar17,0x29);
  auVar17 = vperm2f128_avx(auVar245,auVar245,1);
  auVar17 = vshufps_avx(auVar17,auVar245,0x30);
  auVar22 = vshufps_avx(auVar245,auVar17,0x29);
  auVar17 = vsubps_avx(auVar245,auVar159);
  auVar88 = vsubps_avx(auVar22,local_240);
  fVar209 = auVar88._0_4_ + auVar17._0_4_;
  fVar220 = auVar88._4_4_ + auVar17._4_4_;
  fVar221 = auVar88._8_4_ + auVar17._8_4_;
  fVar222 = auVar88._12_4_ + auVar17._12_4_;
  fVar250 = auVar88._16_4_ + auVar17._16_4_;
  fVar258 = auVar88._20_4_ + auVar17._20_4_;
  fVar259 = auVar88._24_4_ + auVar17._24_4_;
  auVar24._4_4_ = fVar160 * auVar159._4_4_;
  auVar24._0_4_ = fVar163 * auVar159._0_4_;
  auVar24._8_4_ = fVar178 * auVar159._8_4_;
  auVar24._12_4_ = fVar161 * auVar159._12_4_;
  auVar24._16_4_ = fVar179 * auVar159._16_4_;
  auVar24._20_4_ = fVar162 * auVar159._20_4_;
  auVar24._24_4_ = fVar180 * auVar159._24_4_;
  auVar24._28_4_ = auVar17._28_4_;
  auVar25._4_4_ = fVar220 * local_220._4_4_;
  auVar25._0_4_ = fVar209 * local_220._0_4_;
  auVar25._8_4_ = fVar221 * local_220._8_4_;
  auVar25._12_4_ = fVar222 * local_220._12_4_;
  auVar25._16_4_ = fVar250 * local_220._16_4_;
  auVar25._20_4_ = fVar258 * local_220._20_4_;
  auVar25._24_4_ = fVar259 * local_220._24_4_;
  auVar25._28_4_ = fVar278;
  auVar24 = vsubps_avx(auVar24,auVar25);
  local_260 = local_220._0_4_ + local_260;
  fStack_25c = local_220._4_4_ + fStack_25c;
  fStack_258 = local_220._8_4_ + fStack_258;
  fStack_254 = local_220._12_4_ + fStack_254;
  fStack_250 = local_220._16_4_ + fStack_250;
  fStack_24c = local_220._20_4_ + fStack_24c;
  fStack_248 = local_220._24_4_ + fStack_248;
  fStack_244 = local_220._28_4_ + auVar18._28_4_;
  local_280 = local_280 + auVar159._0_4_;
  fStack_27c = fStack_27c + auVar159._4_4_;
  fStack_278 = fStack_278 + auVar159._8_4_;
  fStack_274 = fStack_274 + auVar159._12_4_;
  fStack_270 = fStack_270 + auVar159._16_4_;
  fStack_26c = fStack_26c + auVar159._20_4_;
  fStack_268 = fStack_268 + auVar159._24_4_;
  fStack_264 = fVar281 + auVar159._28_4_;
  auVar18._4_4_ = fVar160 * fStack_27c;
  auVar18._0_4_ = fVar163 * local_280;
  auVar18._8_4_ = fVar178 * fStack_278;
  auVar18._12_4_ = fVar161 * fStack_274;
  auVar18._16_4_ = fVar179 * fStack_270;
  auVar18._20_4_ = fVar162 * fStack_26c;
  auVar18._24_4_ = fVar180 * fStack_268;
  auVar18._28_4_ = fVar281;
  auVar26._4_4_ = fVar220 * fStack_25c;
  auVar26._0_4_ = fVar209 * local_260;
  auVar26._8_4_ = fVar221 * fStack_258;
  auVar26._12_4_ = fVar222 * fStack_254;
  auVar26._16_4_ = fVar250 * fStack_250;
  auVar26._20_4_ = fVar258 * fStack_24c;
  auVar26._24_4_ = fVar259 * fStack_248;
  auVar26._28_4_ = fVar281 + auVar159._28_4_;
  auVar18 = vsubps_avx(auVar18,auVar26);
  local_6a0 = auVar20._0_4_;
  fStack_69c = auVar20._4_4_;
  fStack_698 = auVar20._8_4_;
  fStack_694 = auVar20._12_4_;
  fStack_690 = auVar20._16_4_;
  fStack_68c = auVar20._20_4_;
  fStack_688 = auVar20._24_4_;
  auVar27._4_4_ = fVar160 * fStack_69c;
  auVar27._0_4_ = fVar163 * local_6a0;
  auVar27._8_4_ = fVar178 * fStack_698;
  auVar27._12_4_ = fVar161 * fStack_694;
  auVar27._16_4_ = fVar179 * fStack_690;
  auVar27._20_4_ = fVar162 * fStack_68c;
  auVar27._24_4_ = fVar180 * fStack_688;
  auVar27._28_4_ = fVar281;
  local_720._0_4_ = auVar85._0_4_;
  local_720._4_4_ = auVar85._4_4_;
  fStack_718 = auVar85._8_4_;
  fStack_714 = auVar85._12_4_;
  fStack_710 = auVar85._16_4_;
  fStack_70c = auVar85._20_4_;
  fStack_708 = auVar85._24_4_;
  auVar28._4_4_ = fVar220 * (float)local_720._4_4_;
  auVar28._0_4_ = fVar209 * (float)local_720._0_4_;
  auVar28._8_4_ = fVar221 * fStack_718;
  auVar28._12_4_ = fVar222 * fStack_714;
  auVar28._16_4_ = fVar250 * fStack_710;
  auVar28._20_4_ = fVar258 * fStack_70c;
  auVar28._24_4_ = fVar259 * fStack_708;
  auVar28._28_4_ = local_220._28_4_;
  auVar25 = vsubps_avx(auVar27,auVar28);
  auVar29._4_4_ = local_240._4_4_ * fVar160;
  auVar29._0_4_ = local_240._0_4_ * fVar163;
  auVar29._8_4_ = local_240._8_4_ * fVar178;
  auVar29._12_4_ = local_240._12_4_ * fVar161;
  auVar29._16_4_ = local_240._16_4_ * fVar179;
  auVar29._20_4_ = local_240._20_4_ * fVar162;
  auVar29._24_4_ = local_240._24_4_ * fVar180;
  auVar29._28_4_ = fVar281;
  auVar30._4_4_ = local_560._4_4_ * fVar220;
  auVar30._0_4_ = local_560._0_4_ * fVar209;
  auVar30._8_4_ = local_560._8_4_ * fVar221;
  auVar30._12_4_ = local_560._12_4_ * fVar222;
  auVar30._16_4_ = local_560._16_4_ * fVar250;
  auVar30._20_4_ = local_560._20_4_ * fVar258;
  auVar30._24_4_ = local_560._24_4_ * fVar259;
  auVar30._28_4_ = local_240._28_4_;
  local_660 = auVar19._0_4_;
  fStack_65c = auVar19._4_4_;
  fStack_658 = auVar19._8_4_;
  fStack_654 = auVar19._12_4_;
  fStack_650 = auVar19._16_4_;
  fStack_64c = auVar19._20_4_;
  fStack_648 = auVar19._24_4_;
  auVar26 = vsubps_avx(auVar29,auVar30);
  auVar31._4_4_ = auVar245._4_4_ * fVar160;
  auVar31._0_4_ = auVar245._0_4_ * fVar163;
  auVar31._8_4_ = auVar245._8_4_ * fVar178;
  auVar31._12_4_ = auVar245._12_4_ * fVar161;
  auVar31._16_4_ = auVar245._16_4_ * fVar179;
  auVar31._20_4_ = auVar245._20_4_ * fVar162;
  auVar31._24_4_ = auVar245._24_4_ * fVar180;
  auVar31._28_4_ = fVar281;
  auVar32._4_4_ = fVar220 * auVar219._4_4_;
  auVar32._0_4_ = fVar209 * auVar219._0_4_;
  auVar32._8_4_ = fVar221 * auVar219._8_4_;
  auVar32._12_4_ = fVar222 * auVar219._12_4_;
  auVar32._16_4_ = fVar250 * auVar219._16_4_;
  auVar32._20_4_ = fVar258 * auVar219._20_4_;
  auVar32._24_4_ = fVar259 * auVar219._24_4_;
  auVar32._28_4_ = fStack_244;
  auVar27 = vsubps_avx(auVar31,auVar32);
  local_2a0 = auVar219._0_4_ + local_2a0;
  fStack_29c = auVar219._4_4_ + fStack_29c;
  fStack_298 = auVar219._8_4_ + fStack_298;
  fStack_294 = auVar219._12_4_ + fStack_294;
  fStack_290 = auVar219._16_4_ + fStack_290;
  fStack_28c = auVar219._20_4_ + fStack_28c;
  fStack_288 = auVar219._24_4_ + fStack_288;
  fStack_284 = auVar219._28_4_ + auVar21._28_4_;
  local_2c0 = auVar245._0_4_ + local_2c0;
  fStack_2bc = auVar245._4_4_ + fStack_2bc;
  fStack_2b8 = auVar245._8_4_ + fStack_2b8;
  fStack_2b4 = auVar245._12_4_ + fStack_2b4;
  fStack_2b0 = auVar245._16_4_ + fStack_2b0;
  fStack_2ac = auVar245._20_4_ + fStack_2ac;
  fStack_2a8 = auVar245._24_4_ + fStack_2a8;
  fStack_2a4 = auVar245._28_4_ + auVar195._28_4_;
  auVar21._4_4_ = fVar160 * fStack_2bc;
  auVar21._0_4_ = fVar163 * local_2c0;
  auVar21._8_4_ = fVar178 * fStack_2b8;
  auVar21._12_4_ = fVar161 * fStack_2b4;
  auVar21._16_4_ = fVar179 * fStack_2b0;
  auVar21._20_4_ = fVar162 * fStack_2ac;
  auVar21._24_4_ = fVar180 * fStack_2a8;
  auVar21._28_4_ = auVar245._28_4_ + auVar195._28_4_;
  auVar33._4_4_ = fStack_29c * fVar220;
  auVar33._0_4_ = local_2a0 * fVar209;
  auVar33._8_4_ = fStack_298 * fVar221;
  auVar33._12_4_ = fStack_294 * fVar222;
  auVar33._16_4_ = fStack_290 * fVar250;
  auVar33._20_4_ = fStack_28c * fVar258;
  auVar33._24_4_ = fStack_288 * fVar259;
  auVar33._28_4_ = fStack_284;
  auVar21 = vsubps_avx(auVar21,auVar33);
  auVar34._4_4_ = fVar160 * local_200._4_4_;
  auVar34._0_4_ = fVar163 * local_200._0_4_;
  auVar34._8_4_ = fVar178 * local_200._8_4_;
  auVar34._12_4_ = fVar161 * local_200._12_4_;
  auVar34._16_4_ = fVar179 * local_200._16_4_;
  auVar34._20_4_ = fVar162 * local_200._20_4_;
  auVar34._24_4_ = fVar180 * local_200._24_4_;
  auVar34._28_4_ = fStack_284;
  auVar35._4_4_ = fVar220 * fStack_65c;
  auVar35._0_4_ = fVar209 * local_660;
  auVar35._8_4_ = fVar221 * fStack_658;
  auVar35._12_4_ = fVar222 * fStack_654;
  auVar35._16_4_ = fVar250 * fStack_650;
  auVar35._20_4_ = fVar258 * fStack_64c;
  auVar35._24_4_ = fVar259 * fStack_648;
  auVar35._28_4_ = local_200._28_4_;
  auVar28 = vsubps_avx(auVar34,auVar35);
  auVar36._4_4_ = fVar160 * auVar22._4_4_;
  auVar36._0_4_ = fVar163 * auVar22._0_4_;
  auVar36._8_4_ = fVar178 * auVar22._8_4_;
  auVar36._12_4_ = fVar161 * auVar22._12_4_;
  auVar36._16_4_ = fVar179 * auVar22._16_4_;
  auVar36._20_4_ = fVar162 * auVar22._20_4_;
  auVar36._24_4_ = fVar180 * auVar22._24_4_;
  auVar36._28_4_ = auVar87._28_4_ + auVar23._28_4_;
  auVar23._4_4_ = auVar86._4_4_ * fVar220;
  auVar23._0_4_ = auVar86._0_4_ * fVar209;
  auVar23._8_4_ = auVar86._8_4_ * fVar221;
  auVar23._12_4_ = auVar86._12_4_ * fVar222;
  auVar23._16_4_ = auVar86._16_4_ * fVar250;
  auVar23._20_4_ = auVar86._20_4_ * fVar258;
  auVar23._24_4_ = auVar86._24_4_ * fVar259;
  auVar23._28_4_ = auVar88._28_4_ + auVar17._28_4_;
  auVar23 = vsubps_avx(auVar36,auVar23);
  auVar19 = vminps_avx(auVar24,auVar18);
  auVar85 = vmaxps_avx(auVar24,auVar18);
  auVar20 = vminps_avx(auVar25,auVar26);
  auVar20 = vminps_avx(auVar19,auVar20);
  auVar19 = vmaxps_avx(auVar25,auVar26);
  auVar85 = vmaxps_avx(auVar85,auVar19);
  auVar17 = vminps_avx(auVar27,auVar21);
  auVar19 = vmaxps_avx(auVar27,auVar21);
  auVar18 = vminps_avx(auVar28,auVar23);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar18 = vminps_avx(auVar20,auVar18);
  auVar20 = vmaxps_avx(auVar28,auVar23);
  auVar19 = vmaxps_avx(auVar19,auVar20);
  auVar19 = vmaxps_avx(auVar85,auVar19);
  auVar85 = vcmpps_avx(auVar18,local_1c0,2);
  auVar19 = vcmpps_avx(auVar19,local_1e0,5);
  auVar85 = vandps_avx(auVar19,auVar85);
  auVar19 = local_2e0 & auVar85;
  if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0x7f,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar19 >> 0xbf,0) != '\0') ||
      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0') {
    auVar19 = vsubps_avx(_local_560,local_220);
    auVar20 = vsubps_avx(auVar86,auVar219);
    fVar160 = auVar19._0_4_ + auVar20._0_4_;
    fVar178 = auVar19._4_4_ + auVar20._4_4_;
    fVar161 = auVar19._8_4_ + auVar20._8_4_;
    fVar179 = auVar19._12_4_ + auVar20._12_4_;
    fVar162 = auVar19._16_4_ + auVar20._16_4_;
    fVar180 = auVar19._20_4_ + auVar20._20_4_;
    fVar209 = auVar19._24_4_ + auVar20._24_4_;
    auVar18 = vsubps_avx(local_240,auVar159);
    auVar21 = vsubps_avx(auVar22,auVar245);
    fVar220 = auVar18._0_4_ + auVar21._0_4_;
    fVar221 = auVar18._4_4_ + auVar21._4_4_;
    fVar222 = auVar18._8_4_ + auVar21._8_4_;
    fVar250 = auVar18._12_4_ + auVar21._12_4_;
    fVar258 = auVar18._16_4_ + auVar21._16_4_;
    fVar259 = auVar18._20_4_ + auVar21._20_4_;
    fVar260 = auVar18._24_4_ + auVar21._24_4_;
    fVar163 = auVar21._28_4_;
    auVar37._4_4_ = auVar159._4_4_ * fVar178;
    auVar37._0_4_ = auVar159._0_4_ * fVar160;
    auVar37._8_4_ = auVar159._8_4_ * fVar161;
    auVar37._12_4_ = auVar159._12_4_ * fVar179;
    auVar37._16_4_ = auVar159._16_4_ * fVar162;
    auVar37._20_4_ = auVar159._20_4_ * fVar180;
    auVar37._24_4_ = auVar159._24_4_ * fVar209;
    auVar37._28_4_ = auVar159._28_4_;
    auVar38._4_4_ = local_220._4_4_ * fVar221;
    auVar38._0_4_ = local_220._0_4_ * fVar220;
    auVar38._8_4_ = local_220._8_4_ * fVar222;
    auVar38._12_4_ = local_220._12_4_ * fVar250;
    auVar38._16_4_ = local_220._16_4_ * fVar258;
    auVar38._20_4_ = local_220._20_4_ * fVar259;
    auVar38._24_4_ = local_220._24_4_ * fVar260;
    auVar38._28_4_ = local_220._28_4_;
    auVar21 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = fVar178 * fStack_27c;
    auVar39._0_4_ = fVar160 * local_280;
    auVar39._8_4_ = fVar161 * fStack_278;
    auVar39._12_4_ = fVar179 * fStack_274;
    auVar39._16_4_ = fVar162 * fStack_270;
    auVar39._20_4_ = fVar180 * fStack_26c;
    auVar39._24_4_ = fVar209 * fStack_268;
    auVar39._28_4_ = auVar159._28_4_;
    auVar40._4_4_ = fVar221 * fStack_25c;
    auVar40._0_4_ = fVar220 * local_260;
    auVar40._8_4_ = fVar222 * fStack_258;
    auVar40._12_4_ = fVar250 * fStack_254;
    auVar40._16_4_ = fVar258 * fStack_250;
    auVar40._20_4_ = fVar259 * fStack_24c;
    auVar40._24_4_ = fVar260 * fStack_248;
    auVar40._28_4_ = fVar163;
    auVar23 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar178 * fStack_69c;
    auVar41._0_4_ = fVar160 * local_6a0;
    auVar41._8_4_ = fVar161 * fStack_698;
    auVar41._12_4_ = fVar179 * fStack_694;
    auVar41._16_4_ = fVar162 * fStack_690;
    auVar41._20_4_ = fVar180 * fStack_68c;
    auVar41._24_4_ = fVar209 * fStack_688;
    auVar41._28_4_ = fVar163;
    auVar42._4_4_ = fVar221 * (float)local_720._4_4_;
    auVar42._0_4_ = fVar220 * (float)local_720._0_4_;
    auVar42._8_4_ = fVar222 * fStack_718;
    auVar42._12_4_ = fVar250 * fStack_714;
    auVar42._16_4_ = fVar258 * fStack_710;
    auVar42._20_4_ = fVar259 * fStack_70c;
    auVar42._24_4_ = fVar260 * fStack_708;
    auVar42._28_4_ = auVar17._28_4_;
    auVar87 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = local_240._4_4_ * fVar178;
    auVar43._0_4_ = local_240._0_4_ * fVar160;
    auVar43._8_4_ = local_240._8_4_ * fVar161;
    auVar43._12_4_ = local_240._12_4_ * fVar179;
    auVar43._16_4_ = local_240._16_4_ * fVar162;
    auVar43._20_4_ = local_240._20_4_ * fVar180;
    auVar43._24_4_ = local_240._24_4_ * fVar209;
    auVar43._28_4_ = auVar17._28_4_;
    auVar44._4_4_ = local_560._4_4_ * fVar221;
    auVar44._0_4_ = local_560._0_4_ * fVar220;
    auVar44._8_4_ = local_560._8_4_ * fVar222;
    auVar44._12_4_ = local_560._12_4_ * fVar250;
    auVar44._16_4_ = local_560._16_4_ * fVar258;
    auVar44._20_4_ = local_560._20_4_ * fVar259;
    uVar64 = local_560._28_4_;
    auVar44._24_4_ = local_560._24_4_ * fVar260;
    auVar44._28_4_ = uVar64;
    auVar88 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = auVar245._4_4_ * fVar178;
    auVar45._0_4_ = auVar245._0_4_ * fVar160;
    auVar45._8_4_ = auVar245._8_4_ * fVar161;
    auVar45._12_4_ = auVar245._12_4_ * fVar179;
    auVar45._16_4_ = auVar245._16_4_ * fVar162;
    auVar45._20_4_ = auVar245._20_4_ * fVar180;
    auVar45._24_4_ = auVar245._24_4_ * fVar209;
    auVar45._28_4_ = uVar64;
    auVar46._4_4_ = auVar219._4_4_ * fVar221;
    auVar46._0_4_ = auVar219._0_4_ * fVar220;
    auVar46._8_4_ = auVar219._8_4_ * fVar222;
    auVar46._12_4_ = auVar219._12_4_ * fVar250;
    auVar46._16_4_ = auVar219._16_4_ * fVar258;
    auVar46._20_4_ = auVar219._20_4_ * fVar259;
    auVar46._24_4_ = auVar219._24_4_ * fVar260;
    auVar46._28_4_ = auVar219._28_4_;
    auVar24 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = fVar178 * fStack_2bc;
    auVar47._0_4_ = fVar160 * local_2c0;
    auVar47._8_4_ = fVar161 * fStack_2b8;
    auVar47._12_4_ = fVar179 * fStack_2b4;
    auVar47._16_4_ = fVar162 * fStack_2b0;
    auVar47._20_4_ = fVar180 * fStack_2ac;
    auVar47._24_4_ = fVar209 * fStack_2a8;
    auVar47._28_4_ = uVar64;
    auVar48._4_4_ = fVar221 * fStack_29c;
    auVar48._0_4_ = fVar220 * local_2a0;
    auVar48._8_4_ = fVar222 * fStack_298;
    auVar48._12_4_ = fVar250 * fStack_294;
    auVar48._16_4_ = fVar258 * fStack_290;
    auVar48._20_4_ = fVar259 * fStack_28c;
    auVar48._24_4_ = fVar260 * fStack_288;
    auVar48._28_4_ = auVar245._28_4_;
    auVar25 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = fVar178 * local_200._4_4_;
    auVar49._0_4_ = fVar160 * local_200._0_4_;
    auVar49._8_4_ = fVar161 * local_200._8_4_;
    auVar49._12_4_ = fVar179 * local_200._12_4_;
    auVar49._16_4_ = fVar162 * local_200._16_4_;
    auVar49._20_4_ = fVar180 * local_200._20_4_;
    auVar49._24_4_ = fVar209 * local_200._24_4_;
    auVar49._28_4_ = auVar245._28_4_;
    auVar50._4_4_ = fStack_65c * fVar221;
    auVar50._0_4_ = local_660 * fVar220;
    auVar50._8_4_ = fStack_658 * fVar222;
    auVar50._12_4_ = fStack_654 * fVar250;
    auVar50._16_4_ = fStack_650 * fVar258;
    auVar50._20_4_ = fStack_64c * fVar259;
    auVar50._24_4_ = fStack_648 * fVar260;
    auVar50._28_4_ = local_240._28_4_;
    auVar26 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = fVar178 * auVar22._4_4_;
    auVar51._0_4_ = fVar160 * auVar22._0_4_;
    auVar51._8_4_ = fVar161 * auVar22._8_4_;
    auVar51._12_4_ = fVar179 * auVar22._12_4_;
    auVar51._16_4_ = fVar162 * auVar22._16_4_;
    auVar51._20_4_ = fVar180 * auVar22._20_4_;
    auVar51._24_4_ = fVar209 * auVar22._24_4_;
    auVar51._28_4_ = auVar19._28_4_ + auVar20._28_4_;
    auVar52._4_4_ = auVar86._4_4_ * fVar221;
    auVar52._0_4_ = auVar86._0_4_ * fVar220;
    auVar52._8_4_ = auVar86._8_4_ * fVar222;
    auVar52._12_4_ = auVar86._12_4_ * fVar250;
    auVar52._16_4_ = auVar86._16_4_ * fVar258;
    auVar52._20_4_ = auVar86._20_4_ * fVar259;
    auVar52._24_4_ = auVar86._24_4_ * fVar260;
    auVar52._28_4_ = auVar18._28_4_ + fVar163;
    auVar22 = vsubps_avx(auVar51,auVar52);
    auVar20 = vminps_avx(auVar21,auVar23);
    auVar19 = vmaxps_avx(auVar21,auVar23);
    auVar17 = vminps_avx(auVar87,auVar88);
    auVar17 = vminps_avx(auVar20,auVar17);
    auVar20 = vmaxps_avx(auVar87,auVar88);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar18 = vminps_avx(auVar24,auVar25);
    auVar20 = vmaxps_avx(auVar24,auVar25);
    auVar86 = vminps_avx(auVar26,auVar22);
    auVar18 = vminps_avx(auVar18,auVar86);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar26,auVar22);
    auVar20 = vmaxps_avx(auVar20,auVar17);
    auVar20 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vcmpps_avx(auVar18,local_1c0,2);
    auVar20 = vcmpps_avx(auVar20,local_1e0,5);
    auVar19 = vandps_avx(auVar20,auVar19);
    auVar85 = vandps_avx(local_2e0,auVar85);
    auVar20 = auVar85 & auVar19;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar85 = vandps_avx(auVar19,auVar85);
      uVar57 = vmovmskps_avx(auVar85);
      if (uVar57 != 0) {
        auStack_4c0[uVar63] = uVar57 & 0xff;
        uVar6 = vmovlps_avx(local_420);
        *(undefined8 *)(afStack_340 + uVar63 * 2) = uVar6;
        uVar7 = vmovlps_avx(auVar123);
        auStack_1a0[uVar63] = uVar7;
        uVar63 = (ulong)((int)uVar63 + 1);
      }
    }
  }
LAB_007a703a:
  do {
    do {
      do {
        do {
          if ((int)uVar63 == 0) {
            if (bVar65) goto LAB_007a80b5;
            uVar64 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar84._4_4_ = uVar64;
            auVar84._0_4_ = uVar64;
            auVar84._8_4_ = uVar64;
            auVar84._12_4_ = uVar64;
            auVar73 = vcmpps_avx(local_430,auVar84,2);
            uVar58 = vmovmskps_avx(auVar73);
            uVar59 = (ulong)((uint)uVar66 & uVar58);
            goto LAB_007a6195;
          }
          uVar61 = (int)uVar63 - 1;
          uVar62 = (ulong)uVar61;
          uVar57 = auStack_4c0[uVar62];
          fVar163 = afStack_340[uVar62 * 2];
          fVar160 = afStack_340[uVar62 * 2 + 1];
          auVar293._8_8_ = 0;
          auVar293._0_8_ = auStack_1a0[uVar62];
          auVar297 = ZEXT1664(auVar293);
          uVar7 = 0;
          if (uVar57 != 0) {
            for (; (uVar57 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar57 = uVar57 - 1 & uVar57;
          auStack_4c0[uVar62] = uVar57;
          if (uVar57 == 0) {
            uVar63 = (ulong)uVar61;
          }
          fVar161 = (float)(uVar7 + 1) * 0.14285715;
          fVar178 = (1.0 - (float)uVar7 * 0.14285715) * fVar163 +
                    fVar160 * (float)uVar7 * 0.14285715;
          fVar163 = (1.0 - fVar161) * fVar163 + fVar160 * fVar161;
          fVar160 = fVar163 - fVar178;
          if (0.16666667 <= fVar160) {
            auVar73 = vinsertps_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar163),0x10);
            auVar303 = ZEXT1664(auVar73);
            goto LAB_007a69cb;
          }
          auVar73 = vshufps_avx(auVar293,auVar293,0x50);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar201 = vsubps_avx(auVar98,auVar73);
          fVar161 = auVar73._0_4_;
          fVar179 = auVar73._4_4_;
          fVar162 = auVar73._8_4_;
          fVar180 = auVar73._12_4_;
          fVar209 = auVar201._0_4_;
          fVar220 = auVar201._4_4_;
          fVar221 = auVar201._8_4_;
          fVar222 = auVar201._12_4_;
          auVar128._0_4_ = auVar252._0_4_ * fVar161 + fVar209 * fVar92;
          auVar128._4_4_ = auVar252._4_4_ * fVar179 + fVar220 * fVar120;
          auVar128._8_4_ = auVar252._0_4_ * fVar162 + fVar221 * fVar92;
          auVar128._12_4_ = auVar252._4_4_ * fVar180 + fVar222 * fVar120;
          auVar167._0_4_ = auVar228._0_4_ * fVar161 + fVar209 * fVar93;
          auVar167._4_4_ = auVar228._4_4_ * fVar179 + fVar220 * fVar121;
          auVar167._8_4_ = auVar228._0_4_ * fVar162 + fVar221 * fVar93;
          auVar167._12_4_ = auVar228._4_4_ * fVar180 + fVar222 * fVar121;
          auVar188._0_4_ = auVar241._0_4_ * fVar161 + auVar291._0_4_ * fVar209;
          auVar188._4_4_ = auVar241._4_4_ * fVar179 + auVar291._4_4_ * fVar220;
          auVar188._8_4_ = auVar241._0_4_ * fVar162 + auVar291._0_4_ * fVar221;
          auVar188._12_4_ = auVar241._4_4_ * fVar180 + auVar291._4_4_ * fVar222;
          auVar70._0_4_ = auVar97._0_4_ * fVar161 + auVar284._0_4_ * fVar209;
          auVar70._4_4_ = auVar97._4_4_ * fVar179 + auVar284._4_4_ * fVar220;
          auVar70._8_4_ = auVar97._0_4_ * fVar162 + auVar284._0_4_ * fVar221;
          auVar70._12_4_ = auVar97._4_4_ * fVar180 + auVar284._4_4_ * fVar222;
          auVar116._16_16_ = auVar128;
          auVar116._0_16_ = auVar128;
          auVar146._16_16_ = auVar167;
          auVar146._0_16_ = auVar167;
          auVar177._16_16_ = auVar188;
          auVar177._0_16_ = auVar188;
          auVar85 = ZEXT2032(CONCAT416(fVar163,ZEXT416((uint)fVar178)));
          auVar85 = vshufps_avx(auVar85,auVar85,0);
          auVar19 = vsubps_avx(auVar146,auVar116);
          fVar161 = auVar85._0_4_;
          fVar179 = auVar85._4_4_;
          fVar162 = auVar85._8_4_;
          fVar180 = auVar85._12_4_;
          fVar209 = auVar85._16_4_;
          fVar220 = auVar85._20_4_;
          fVar221 = auVar85._24_4_;
          auVar117._0_4_ = auVar128._0_4_ + auVar19._0_4_ * fVar161;
          auVar117._4_4_ = auVar128._4_4_ + auVar19._4_4_ * fVar179;
          auVar117._8_4_ = auVar128._8_4_ + auVar19._8_4_ * fVar162;
          auVar117._12_4_ = auVar128._12_4_ + auVar19._12_4_ * fVar180;
          auVar117._16_4_ = auVar128._0_4_ + auVar19._16_4_ * fVar209;
          auVar117._20_4_ = auVar128._4_4_ + auVar19._20_4_ * fVar220;
          auVar117._24_4_ = auVar128._8_4_ + auVar19._24_4_ * fVar221;
          auVar117._28_4_ = auVar128._12_4_ + auVar19._28_4_;
          auVar85 = vsubps_avx(auVar177,auVar146);
          auVar147._0_4_ = auVar167._0_4_ + auVar85._0_4_ * fVar161;
          auVar147._4_4_ = auVar167._4_4_ + auVar85._4_4_ * fVar179;
          auVar147._8_4_ = auVar167._8_4_ + auVar85._8_4_ * fVar162;
          auVar147._12_4_ = auVar167._12_4_ + auVar85._12_4_ * fVar180;
          auVar147._16_4_ = auVar167._0_4_ + auVar85._16_4_ * fVar209;
          auVar147._20_4_ = auVar167._4_4_ + auVar85._20_4_ * fVar220;
          auVar147._24_4_ = auVar167._8_4_ + auVar85._24_4_ * fVar221;
          auVar147._28_4_ = auVar167._12_4_ + auVar85._28_4_;
          auVar73 = vsubps_avx(auVar70,auVar188);
          auVar89._0_4_ = auVar188._0_4_ + auVar73._0_4_ * fVar161;
          auVar89._4_4_ = auVar188._4_4_ + auVar73._4_4_ * fVar179;
          auVar89._8_4_ = auVar188._8_4_ + auVar73._8_4_ * fVar162;
          auVar89._12_4_ = auVar188._12_4_ + auVar73._12_4_ * fVar180;
          auVar89._16_4_ = auVar188._0_4_ + auVar73._0_4_ * fVar209;
          auVar89._20_4_ = auVar188._4_4_ + auVar73._4_4_ * fVar220;
          auVar89._24_4_ = auVar188._8_4_ + auVar73._8_4_ * fVar221;
          auVar89._28_4_ = auVar188._12_4_ + auVar73._12_4_;
          auVar85 = vsubps_avx(auVar147,auVar117);
          auVar118._0_4_ = auVar117._0_4_ + fVar161 * auVar85._0_4_;
          auVar118._4_4_ = auVar117._4_4_ + fVar179 * auVar85._4_4_;
          auVar118._8_4_ = auVar117._8_4_ + fVar162 * auVar85._8_4_;
          auVar118._12_4_ = auVar117._12_4_ + fVar180 * auVar85._12_4_;
          auVar118._16_4_ = auVar117._16_4_ + fVar209 * auVar85._16_4_;
          auVar118._20_4_ = auVar117._20_4_ + fVar220 * auVar85._20_4_;
          auVar118._24_4_ = auVar117._24_4_ + fVar221 * auVar85._24_4_;
          auVar118._28_4_ = auVar117._28_4_ + auVar85._28_4_;
          auVar85 = vsubps_avx(auVar89,auVar147);
          auVar90._0_4_ = auVar147._0_4_ + fVar161 * auVar85._0_4_;
          auVar90._4_4_ = auVar147._4_4_ + fVar179 * auVar85._4_4_;
          auVar90._8_4_ = auVar147._8_4_ + fVar162 * auVar85._8_4_;
          auVar90._12_4_ = auVar147._12_4_ + fVar180 * auVar85._12_4_;
          auVar90._16_4_ = auVar147._16_4_ + fVar209 * auVar85._16_4_;
          auVar90._20_4_ = auVar147._20_4_ + fVar220 * auVar85._20_4_;
          auVar90._24_4_ = auVar147._24_4_ + fVar221 * auVar85._24_4_;
          auVar90._28_4_ = auVar147._28_4_ + auVar85._28_4_;
          auVar85 = vsubps_avx(auVar90,auVar118);
          auVar204._0_4_ = auVar118._0_4_ + fVar161 * auVar85._0_4_;
          auVar204._4_4_ = auVar118._4_4_ + fVar179 * auVar85._4_4_;
          auVar204._8_4_ = auVar118._8_4_ + fVar162 * auVar85._8_4_;
          auVar204._12_4_ = auVar118._12_4_ + fVar180 * auVar85._12_4_;
          auVar208._16_4_ = auVar118._16_4_ + fVar209 * auVar85._16_4_;
          auVar208._0_16_ = auVar204;
          auVar208._20_4_ = auVar118._20_4_ + fVar220 * auVar85._20_4_;
          auVar208._24_4_ = auVar118._24_4_ + fVar221 * auVar85._24_4_;
          auVar208._28_4_ = auVar118._28_4_ + auVar147._28_4_;
          auVar95 = auVar208._16_16_;
          auVar100 = vshufps_avx(ZEXT416((uint)(fVar160 * 0.33333334)),
                                 ZEXT416((uint)(fVar160 * 0.33333334)),0);
          auVar168._0_4_ = auVar204._0_4_ + auVar100._0_4_ * auVar85._0_4_ * 3.0;
          auVar168._4_4_ = auVar204._4_4_ + auVar100._4_4_ * auVar85._4_4_ * 3.0;
          auVar168._8_4_ = auVar204._8_4_ + auVar100._8_4_ * auVar85._8_4_ * 3.0;
          auVar168._12_4_ = auVar204._12_4_ + auVar100._12_4_ * auVar85._12_4_ * 3.0;
          auVar144 = vshufpd_avx(auVar204,auVar204,3);
          auVar68 = vshufpd_avx(auVar95,auVar95,3);
          _local_560 = auVar144;
          auVar73 = vsubps_avx(auVar144,auVar204);
          auVar201 = vsubps_avx(auVar68,auVar95);
          auVar71._0_4_ = auVar73._0_4_ + auVar201._0_4_;
          auVar71._4_4_ = auVar73._4_4_ + auVar201._4_4_;
          auVar71._8_4_ = auVar73._8_4_ + auVar201._8_4_;
          auVar71._12_4_ = auVar73._12_4_ + auVar201._12_4_;
          auVar73 = vmovshdup_avx(auVar204);
          auVar201 = vmovshdup_avx(auVar168);
          auVar130 = vshufps_avx(auVar71,auVar71,0);
          auVar67 = vshufps_avx(auVar71,auVar71,0x55);
          fVar161 = auVar67._0_4_;
          fVar179 = auVar67._4_4_;
          fVar162 = auVar67._8_4_;
          fVar180 = auVar67._12_4_;
          fVar209 = auVar130._0_4_;
          fVar220 = auVar130._4_4_;
          fVar221 = auVar130._8_4_;
          fVar222 = auVar130._12_4_;
          auVar72._0_4_ = fVar209 * auVar204._0_4_ + auVar73._0_4_ * fVar161;
          auVar72._4_4_ = fVar220 * auVar204._4_4_ + auVar73._4_4_ * fVar179;
          auVar72._8_4_ = fVar221 * auVar204._8_4_ + auVar73._8_4_ * fVar162;
          auVar72._12_4_ = fVar222 * auVar204._12_4_ + auVar73._12_4_ * fVar180;
          auVar265._0_4_ = fVar209 * auVar168._0_4_ + auVar201._0_4_ * fVar161;
          auVar265._4_4_ = fVar220 * auVar168._4_4_ + auVar201._4_4_ * fVar179;
          auVar265._8_4_ = fVar221 * auVar168._8_4_ + auVar201._8_4_ * fVar162;
          auVar265._12_4_ = fVar222 * auVar168._12_4_ + auVar201._12_4_ * fVar180;
          auVar201 = vshufps_avx(auVar72,auVar72,0xe8);
          auVar130 = vshufps_avx(auVar265,auVar265,0xe8);
          auVar73 = vcmpps_avx(auVar201,auVar130,1);
          uVar57 = vextractps_avx(auVar73,0);
          auVar67 = auVar265;
          if ((uVar57 & 1) == 0) {
            auVar67 = auVar72;
          }
          auVar99._0_4_ = auVar100._0_4_ * auVar85._16_4_ * 3.0;
          auVar99._4_4_ = auVar100._4_4_ * auVar85._20_4_ * 3.0;
          auVar99._8_4_ = auVar100._8_4_ * auVar85._24_4_ * 3.0;
          auVar99._12_4_ = auVar100._12_4_ * 0.0;
          auVar94 = vsubps_avx(auVar95,auVar99);
          auVar100 = vmovshdup_avx(auVar94);
          auVar95 = vmovshdup_avx(auVar95);
          fVar250 = auVar94._0_4_;
          fVar258 = auVar94._4_4_;
          auVar189._0_4_ = fVar250 * fVar209 + auVar100._0_4_ * fVar161;
          auVar189._4_4_ = fVar258 * fVar220 + auVar100._4_4_ * fVar179;
          auVar189._8_4_ = auVar94._8_4_ * fVar221 + auVar100._8_4_ * fVar162;
          auVar189._12_4_ = auVar94._12_4_ * fVar222 + auVar100._12_4_ * fVar180;
          auVar302._0_4_ = fVar209 * auVar208._16_4_ + auVar95._0_4_ * fVar161;
          auVar302._4_4_ = fVar220 * auVar208._20_4_ + auVar95._4_4_ * fVar179;
          auVar302._8_4_ = fVar221 * auVar208._24_4_ + auVar95._8_4_ * fVar162;
          auVar302._12_4_ = fVar222 * auVar208._28_4_ + auVar95._12_4_ * fVar180;
          auVar95 = vshufps_avx(auVar189,auVar189,0xe8);
          auVar122 = vshufps_avx(auVar302,auVar302,0xe8);
          auVar100 = vcmpps_avx(auVar95,auVar122,1);
          uVar57 = vextractps_avx(auVar100,0);
          auVar123 = auVar302;
          if ((uVar57 & 1) == 0) {
            auVar123 = auVar189;
          }
          auVar67 = vmaxss_avx(auVar123,auVar67);
          auVar201 = vminps_avx(auVar201,auVar130);
          auVar130 = vminps_avx(auVar95,auVar122);
          auVar130 = vminps_avx(auVar201,auVar130);
          auVar73 = vshufps_avx(auVar73,auVar73,0x55);
          auVar73 = vblendps_avx(auVar73,auVar100,2);
          auVar100 = vpslld_avx(auVar73,0x1f);
          auVar73 = vshufpd_avx(auVar265,auVar265,1);
          auVar73 = vinsertps_avx(auVar73,auVar302,0x9c);
          auVar201 = vshufpd_avx(auVar72,auVar72,1);
          auVar201 = vinsertps_avx(auVar201,auVar189,0x9c);
          auVar73 = vblendvps_avx(auVar201,auVar73,auVar100);
          auVar201 = vmovshdup_avx(auVar73);
          auVar73 = vmaxss_avx(auVar201,auVar73);
          fVar162 = auVar130._0_4_;
          auVar201 = vmovshdup_avx(auVar130);
          fVar179 = auVar73._0_4_;
          fVar180 = auVar201._0_4_;
          fVar161 = auVar67._0_4_;
          if ((fVar162 < 0.0001) && (-0.0001 < fVar179)) break;
          if ((fVar180 < 0.0001 && -0.0001 < fVar161) || (fVar162 < 0.0001 && -0.0001 < fVar161))
          break;
          auVar100 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar73,1);
          auVar201 = vcmpps_avx(auVar201,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar201 = vandps_avx(auVar201,auVar100);
        } while ((auVar201 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar100 = vcmpps_avx(auVar130,_DAT_01f45a50,1);
        auVar201 = vcmpss_avx(auVar67,ZEXT416(0) << 0x20,1);
        auVar129._8_4_ = 0x3f800000;
        auVar129._0_8_ = 0x3f8000003f800000;
        auVar129._12_4_ = 0x3f800000;
        auVar169._8_4_ = 0xbf800000;
        auVar169._0_8_ = 0xbf800000bf800000;
        auVar169._12_4_ = 0xbf800000;
        auVar201 = vblendvps_avx(auVar129,auVar169,auVar201);
        auVar100 = vblendvps_avx(auVar129,auVar169,auVar100);
        auVar130 = vcmpss_avx(auVar100,auVar201,4);
        auVar130 = vpshufd_avx(ZEXT416(auVar130._0_4_ & 1),0x50);
        auVar130 = vpslld_avx(auVar130,0x1f);
        auVar130 = vpsrad_avx(auVar130,0x1f);
        auVar130 = vpandn_avx(auVar130,_DAT_01f7afb0);
        auVar67 = vmovshdup_avx(auVar100);
        fVar209 = auVar67._0_4_;
        if ((auVar100._0_4_ != fVar209) || (NAN(auVar100._0_4_) || NAN(fVar209))) {
          if ((fVar180 != fVar162) || (NAN(fVar180) || NAN(fVar162))) {
            fVar162 = -fVar162 / (fVar180 - fVar162);
            auVar100 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar162) * 0.0 + fVar162)));
          }
          else {
            auVar100 = ZEXT816(0x3f80000000000000);
            if ((fVar162 != 0.0) || (NAN(fVar162))) {
              auVar100 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar95 = vcmpps_avx(auVar130,auVar100,1);
          auVar67 = vblendps_avx(auVar130,auVar100,2);
          auVar100 = vblendps_avx(auVar100,auVar130,2);
          auVar130 = vblendvps_avx(auVar100,auVar67,auVar95);
        }
        auVar73 = vcmpss_avx(auVar73,ZEXT416(0) << 0x20,1);
        auVar131._8_4_ = 0x3f800000;
        auVar131._0_8_ = 0x3f8000003f800000;
        auVar131._12_4_ = 0x3f800000;
        auVar170._8_4_ = 0xbf800000;
        auVar170._0_8_ = 0xbf800000bf800000;
        auVar170._12_4_ = 0xbf800000;
        auVar73 = vblendvps_avx(auVar131,auVar170,auVar73);
        fVar162 = auVar73._0_4_;
        if ((auVar201._0_4_ != fVar162) || (NAN(auVar201._0_4_) || NAN(fVar162))) {
          if ((fVar179 != fVar161) || (NAN(fVar179) || NAN(fVar161))) {
            fVar161 = -fVar161 / (fVar179 - fVar161);
            auVar73 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar161) * 0.0 + fVar161)));
          }
          else {
            auVar73 = ZEXT816(0x3f80000000000000);
            if ((fVar161 != 0.0) || (NAN(fVar161))) {
              auVar73 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar100 = vcmpps_avx(auVar130,auVar73,1);
          auVar201 = vblendps_avx(auVar130,auVar73,2);
          auVar73 = vblendps_avx(auVar73,auVar130,2);
          auVar130 = vblendvps_avx(auVar73,auVar201,auVar100);
        }
        if ((fVar209 != fVar162) || (NAN(fVar209) || NAN(fVar162))) {
          auVar74._8_4_ = 0x3f800000;
          auVar74._0_8_ = 0x3f8000003f800000;
          auVar74._12_4_ = 0x3f800000;
          auVar73 = vcmpps_avx(auVar130,auVar74,1);
          auVar201 = vinsertps_avx(auVar130,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar132._4_12_ = auVar130._4_12_;
          auVar132._0_4_ = 0x3f800000;
          auVar130 = vblendvps_avx(auVar132,auVar201,auVar73);
        }
        auVar73 = vcmpps_avx(auVar130,_DAT_01f46740,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar130._4_12_;
        auVar201 = vinsertps_avx(auVar130,ZEXT416(0x3f800000),0x10);
        auVar73 = vblendvps_avx(auVar201,auVar54 << 0x20,auVar73);
        auVar201 = vmovshdup_avx(auVar73);
      } while (auVar201._0_4_ < auVar73._0_4_);
      auVar75._0_4_ = auVar73._0_4_ + -0.1;
      auVar75._4_4_ = auVar73._4_4_ + 0.1;
      auVar75._8_4_ = auVar73._8_4_ + 0.0;
      auVar75._12_4_ = auVar73._12_4_ + 0.0;
      auVar100 = vshufpd_avx(auVar168,auVar168,3);
      auVar205._8_8_ = 0x3f80000000000000;
      auVar205._0_8_ = 0x3f80000000000000;
      auVar73 = vcmpps_avx(auVar75,auVar205,1);
      auVar53._12_4_ = 0;
      auVar53._0_12_ = auVar75._4_12_;
      auVar201 = vinsertps_avx(auVar75,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar73 = vblendvps_avx(auVar201,auVar53 << 0x20,auVar73);
      auVar201 = vshufpd_avx(auVar94,auVar94,3);
      auVar130 = vshufps_avx(auVar73,auVar73,0x50);
      auVar206._8_4_ = 0x3f800000;
      auVar206._0_8_ = 0x3f8000003f800000;
      auVar206._12_4_ = 0x3f800000;
      auVar67 = vsubps_avx(auVar206,auVar130);
      local_560._0_4_ = auVar144._0_4_;
      local_560._4_4_ = auVar144._4_4_;
      fStack_558 = auVar144._8_4_;
      fStack_554 = auVar144._12_4_;
      fVar161 = auVar130._0_4_;
      fVar179 = auVar130._4_4_;
      fVar162 = auVar130._8_4_;
      fVar180 = auVar130._12_4_;
      local_6c0 = auVar68._0_4_;
      fStack_6bc = auVar68._4_4_;
      fStack_6b8 = auVar68._8_4_;
      fStack_6b4 = auVar68._12_4_;
      fVar209 = auVar67._0_4_;
      fVar220 = auVar67._4_4_;
      fVar221 = auVar67._8_4_;
      fVar222 = auVar67._12_4_;
      auVar76._0_4_ = fVar161 * (float)local_560._0_4_ + fVar209 * auVar204._0_4_;
      auVar76._4_4_ = fVar179 * (float)local_560._4_4_ + fVar220 * auVar204._4_4_;
      auVar76._8_4_ = fVar162 * fStack_558 + fVar221 * auVar204._0_4_;
      auVar76._12_4_ = fVar180 * fStack_554 + fVar222 * auVar204._4_4_;
      auVar190._0_4_ = auVar100._0_4_ * fVar161 + fVar209 * auVar168._0_4_;
      auVar190._4_4_ = auVar100._4_4_ * fVar179 + fVar220 * auVar168._4_4_;
      auVar190._8_4_ = auVar100._8_4_ * fVar162 + fVar221 * auVar168._0_4_;
      auVar190._12_4_ = auVar100._12_4_ * fVar180 + fVar222 * auVar168._4_4_;
      auVar218._0_4_ = auVar201._0_4_ * fVar161 + fVar209 * fVar250;
      auVar218._4_4_ = auVar201._4_4_ * fVar179 + fVar220 * fVar258;
      auVar218._8_4_ = auVar201._8_4_ * fVar162 + fVar221 * fVar250;
      auVar218._12_4_ = auVar201._12_4_ * fVar180 + fVar222 * fVar258;
      auVar253._0_4_ = fVar161 * local_6c0 + fVar209 * auVar208._16_4_;
      auVar253._4_4_ = fVar179 * fStack_6bc + fVar220 * auVar208._20_4_;
      auVar253._8_4_ = fVar162 * fStack_6b8 + fVar221 * auVar208._16_4_;
      auVar253._12_4_ = fVar180 * fStack_6b4 + fVar222 * auVar208._20_4_;
      auVar68 = vsubps_avx(auVar206,auVar73);
      auVar201 = vmovshdup_avx(auVar293);
      auVar144 = vmovsldup_avx(auVar293);
      auVar207._0_4_ = auVar68._0_4_ * auVar144._0_4_ + auVar73._0_4_ * auVar201._0_4_;
      auVar207._4_4_ = auVar68._4_4_ * auVar144._4_4_ + auVar73._4_4_ * auVar201._4_4_;
      auVar207._8_4_ = auVar68._8_4_ * auVar144._8_4_ + auVar73._8_4_ * auVar201._8_4_;
      auVar207._12_4_ = auVar68._12_4_ * auVar144._12_4_ + auVar73._12_4_ * auVar201._12_4_;
      auVar94 = vmovshdup_avx(auVar207);
      auVar73 = vsubps_avx(auVar190,auVar76);
      auVar133._0_4_ = auVar73._0_4_ * 3.0;
      auVar133._4_4_ = auVar73._4_4_ * 3.0;
      auVar133._8_4_ = auVar73._8_4_ * 3.0;
      auVar133._12_4_ = auVar73._12_4_ * 3.0;
      auVar73 = vsubps_avx(auVar218,auVar190);
      auVar156._0_4_ = auVar73._0_4_ * 3.0;
      auVar156._4_4_ = auVar73._4_4_ * 3.0;
      auVar156._8_4_ = auVar73._8_4_ * 3.0;
      auVar156._12_4_ = auVar73._12_4_ * 3.0;
      auVar73 = vsubps_avx(auVar253,auVar218);
      auVar229._0_4_ = auVar73._0_4_ * 3.0;
      auVar229._4_4_ = auVar73._4_4_ * 3.0;
      auVar229._8_4_ = auVar73._8_4_ * 3.0;
      auVar229._12_4_ = auVar73._12_4_ * 3.0;
      auVar201 = vminps_avx(auVar156,auVar229);
      auVar73 = vmaxps_avx(auVar156,auVar229);
      auVar201 = vminps_avx(auVar133,auVar201);
      auVar73 = vmaxps_avx(auVar133,auVar73);
      auVar144 = vshufpd_avx(auVar201,auVar201,3);
      auVar68 = vshufpd_avx(auVar73,auVar73,3);
      auVar201 = vminps_avx(auVar201,auVar144);
      auVar73 = vmaxps_avx(auVar73,auVar68);
      auVar144 = vshufps_avx(ZEXT416((uint)(1.0 / fVar160)),ZEXT416((uint)(1.0 / fVar160)),0);
      auVar230._0_4_ = auVar144._0_4_ * auVar201._0_4_;
      auVar230._4_4_ = auVar144._4_4_ * auVar201._4_4_;
      auVar230._8_4_ = auVar144._8_4_ * auVar201._8_4_;
      auVar230._12_4_ = auVar144._12_4_ * auVar201._12_4_;
      auVar242._0_4_ = auVar144._0_4_ * auVar73._0_4_;
      auVar242._4_4_ = auVar144._4_4_ * auVar73._4_4_;
      auVar242._8_4_ = auVar144._8_4_ * auVar73._8_4_;
      auVar242._12_4_ = auVar144._12_4_ * auVar73._12_4_;
      auVar67 = ZEXT416((uint)(1.0 / (auVar94._0_4_ - auVar207._0_4_)));
      auVar73 = vshufpd_avx(auVar76,auVar76,3);
      auVar201 = vshufpd_avx(auVar190,auVar190,3);
      auVar144 = vshufpd_avx(auVar218,auVar218,3);
      auVar68 = vshufpd_avx(auVar253,auVar253,3);
      auVar73 = vsubps_avx(auVar73,auVar76);
      auVar100 = vsubps_avx(auVar201,auVar190);
      auVar130 = vsubps_avx(auVar144,auVar218);
      auVar68 = vsubps_avx(auVar68,auVar253);
      auVar201 = vminps_avx(auVar73,auVar100);
      auVar73 = vmaxps_avx(auVar73,auVar100);
      auVar144 = vminps_avx(auVar130,auVar68);
      auVar144 = vminps_avx(auVar201,auVar144);
      auVar201 = vmaxps_avx(auVar130,auVar68);
      auVar73 = vmaxps_avx(auVar73,auVar201);
      auVar201 = vshufps_avx(auVar67,auVar67,0);
      auVar285._0_4_ = auVar201._0_4_ * auVar144._0_4_;
      auVar285._4_4_ = auVar201._4_4_ * auVar144._4_4_;
      auVar285._8_4_ = auVar201._8_4_ * auVar144._8_4_;
      auVar285._12_4_ = auVar201._12_4_ * auVar144._12_4_;
      auVar294._0_4_ = auVar201._0_4_ * auVar73._0_4_;
      auVar294._4_4_ = auVar201._4_4_ * auVar73._4_4_;
      auVar294._8_4_ = auVar201._8_4_ * auVar73._8_4_;
      auVar294._12_4_ = auVar201._12_4_ * auVar73._12_4_;
      auVar73 = vmovsldup_avx(auVar207);
      auVar254._4_12_ = auVar73._4_12_;
      auVar254._0_4_ = fVar178;
      auVar266._4_12_ = auVar207._4_12_;
      auVar266._0_4_ = fVar163;
      auVar157._0_4_ = (fVar178 + fVar163) * 0.5;
      auVar157._4_4_ = (auVar73._4_4_ + auVar207._4_4_) * 0.5;
      auVar157._8_4_ = (auVar73._8_4_ + auVar207._8_4_) * 0.5;
      auVar157._12_4_ = (auVar73._12_4_ + auVar207._12_4_) * 0.5;
      auVar73 = vshufps_avx(auVar157,auVar157,0);
      fVar161 = auVar73._0_4_;
      fVar179 = auVar73._4_4_;
      fVar162 = auVar73._8_4_;
      fVar180 = auVar73._12_4_;
      local_6d0._0_4_ = auVar15._0_4_;
      local_6d0._4_4_ = auVar15._4_4_;
      fStack_6c8 = auVar15._8_4_;
      fStack_6c4 = auVar15._12_4_;
      auVar101._0_4_ = fVar161 * (float)local_350._0_4_ + (float)local_6d0._0_4_;
      auVar101._4_4_ = fVar179 * (float)local_350._4_4_ + (float)local_6d0._4_4_;
      auVar101._8_4_ = fVar162 * fStack_348 + fStack_6c8;
      auVar101._12_4_ = fVar180 * fStack_344 + fStack_6c4;
      local_5b0 = auVar264._0_4_;
      fStack_5ac = auVar264._4_4_;
      fStack_5a8 = auVar264._8_4_;
      fStack_5a4 = auVar264._12_4_;
      auVar134._0_4_ = fVar161 * (float)local_360._0_4_ + local_5b0;
      auVar134._4_4_ = fVar179 * (float)local_360._4_4_ + fStack_5ac;
      auVar134._8_4_ = fVar162 * fStack_358 + fStack_5a8;
      auVar134._12_4_ = fVar180 * fStack_354 + fStack_5a4;
      local_5c0 = auVar16._0_4_;
      fStack_5bc = auVar16._4_4_;
      fStack_5b8 = auVar16._8_4_;
      fStack_5b4 = auVar16._12_4_;
      auVar191._0_4_ = fVar161 * (float)local_370._0_4_ + local_5c0;
      auVar191._4_4_ = fVar179 * (float)local_370._4_4_ + fStack_5bc;
      auVar191._8_4_ = fVar162 * fStack_368 + fStack_5b8;
      auVar191._12_4_ = fVar180 * fStack_364 + fStack_5b4;
      auVar73 = vsubps_avx(auVar134,auVar101);
      auVar102._0_4_ = auVar101._0_4_ + fVar161 * auVar73._0_4_;
      auVar102._4_4_ = auVar101._4_4_ + fVar179 * auVar73._4_4_;
      auVar102._8_4_ = auVar101._8_4_ + fVar162 * auVar73._8_4_;
      auVar102._12_4_ = auVar101._12_4_ + fVar180 * auVar73._12_4_;
      auVar73 = vsubps_avx(auVar191,auVar134);
      auVar135._0_4_ = auVar134._0_4_ + fVar161 * auVar73._0_4_;
      auVar135._4_4_ = auVar134._4_4_ + fVar179 * auVar73._4_4_;
      auVar135._8_4_ = auVar134._8_4_ + fVar162 * auVar73._8_4_;
      auVar135._12_4_ = auVar134._12_4_ + fVar180 * auVar73._12_4_;
      auVar73 = vsubps_avx(auVar135,auVar102);
      fVar161 = auVar102._0_4_ + fVar161 * auVar73._0_4_;
      fVar179 = auVar102._4_4_ + fVar179 * auVar73._4_4_;
      auVar77._0_8_ = CONCAT44(fVar179,fVar161);
      auVar77._8_4_ = auVar102._8_4_ + fVar162 * auVar73._8_4_;
      auVar77._12_4_ = auVar102._12_4_ + fVar180 * auVar73._12_4_;
      fVar162 = auVar73._0_4_ * 3.0;
      fVar180 = auVar73._4_4_ * 3.0;
      auVar103._0_8_ = CONCAT44(fVar180,fVar162);
      auVar103._8_4_ = auVar73._8_4_ * 3.0;
      auVar103._12_4_ = auVar73._12_4_ * 3.0;
      auVar136._8_8_ = auVar77._0_8_;
      auVar136._0_8_ = auVar77._0_8_;
      auVar73 = vshufpd_avx(auVar77,auVar77,3);
      auVar201 = vshufps_avx(auVar157,auVar157,0x55);
      auVar130 = vsubps_avx(auVar73,auVar136);
      auVar274._0_4_ = auVar130._0_4_ * auVar201._0_4_ + fVar161;
      auVar274._4_4_ = auVar130._4_4_ * auVar201._4_4_ + fVar179;
      auVar274._8_4_ = auVar130._8_4_ * auVar201._8_4_ + fVar161;
      auVar274._12_4_ = auVar130._12_4_ * auVar201._12_4_ + fVar179;
      auVar137._8_8_ = auVar103._0_8_;
      auVar137._0_8_ = auVar103._0_8_;
      auVar73 = vshufpd_avx(auVar103,auVar103,1);
      auVar73 = vsubps_avx(auVar73,auVar137);
      auVar104._0_4_ = auVar73._0_4_ * auVar201._0_4_ + fVar162;
      auVar104._4_4_ = auVar73._4_4_ * auVar201._4_4_ + fVar180;
      auVar104._8_4_ = auVar73._8_4_ * auVar201._8_4_ + fVar162;
      auVar104._12_4_ = auVar73._12_4_ * auVar201._12_4_ + fVar180;
      auVar201 = vmovshdup_avx(auVar104);
      auVar192._0_8_ = auVar201._0_8_ ^ 0x8000000080000000;
      auVar192._8_4_ = auVar201._8_4_ ^ 0x80000000;
      auVar192._12_4_ = auVar201._12_4_ ^ 0x80000000;
      auVar144 = vmovshdup_avx(auVar130);
      auVar73 = vunpcklps_avx(auVar144,auVar192);
      auVar68 = vshufps_avx(auVar73,auVar192,4);
      auVar78._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
      auVar78._8_4_ = -auVar130._8_4_;
      auVar78._12_4_ = -auVar130._12_4_;
      auVar73 = vmovlhps_avx(auVar78,auVar104);
      auVar100 = vshufps_avx(auVar73,auVar104,8);
      auVar73 = ZEXT416((uint)(auVar104._0_4_ * auVar144._0_4_ - auVar130._0_4_ * auVar201._0_4_));
      auVar201 = vshufps_avx(auVar73,auVar73,0);
      auVar73 = vdivps_avx(auVar68,auVar201);
      auVar201 = vdivps_avx(auVar100,auVar201);
      auVar100 = vinsertps_avx(auVar230,auVar285,0x1c);
      auVar130 = vinsertps_avx(auVar242,auVar294,0x1c);
      auVar67 = vinsertps_avx(auVar285,auVar230,0x4c);
      auVar95 = vinsertps_avx(auVar294,auVar242,0x4c);
      auVar144 = vmovsldup_avx(auVar73);
      auVar138._0_4_ = auVar144._0_4_ * auVar100._0_4_;
      auVar138._4_4_ = auVar144._4_4_ * auVar100._4_4_;
      auVar138._8_4_ = auVar144._8_4_ * auVar100._8_4_;
      auVar138._12_4_ = auVar144._12_4_ * auVar100._12_4_;
      auVar105._0_4_ = auVar130._0_4_ * auVar144._0_4_;
      auVar105._4_4_ = auVar130._4_4_ * auVar144._4_4_;
      auVar105._8_4_ = auVar130._8_4_ * auVar144._8_4_;
      auVar105._12_4_ = auVar130._12_4_ * auVar144._12_4_;
      auVar68 = vminps_avx(auVar138,auVar105);
      auVar144 = vmaxps_avx(auVar105,auVar138);
      auVar122 = vmovsldup_avx(auVar201);
      auVar295._0_4_ = auVar67._0_4_ * auVar122._0_4_;
      auVar295._4_4_ = auVar67._4_4_ * auVar122._4_4_;
      auVar295._8_4_ = auVar67._8_4_ * auVar122._8_4_;
      auVar295._12_4_ = auVar67._12_4_ * auVar122._12_4_;
      auVar139._0_4_ = auVar95._0_4_ * auVar122._0_4_;
      auVar139._4_4_ = auVar95._4_4_ * auVar122._4_4_;
      auVar139._8_4_ = auVar95._8_4_ * auVar122._8_4_;
      auVar139._12_4_ = auVar95._12_4_ * auVar122._12_4_;
      auVar122 = vminps_avx(auVar295,auVar139);
      auVar171._0_4_ = auVar68._0_4_ + auVar122._0_4_;
      auVar171._4_4_ = auVar68._4_4_ + auVar122._4_4_;
      auVar171._8_4_ = auVar68._8_4_ + auVar122._8_4_;
      auVar171._12_4_ = auVar68._12_4_ + auVar122._12_4_;
      auVar68 = vmaxps_avx(auVar139,auVar295);
      auVar122 = vsubps_avx(auVar254,auVar157);
      auVar123 = vsubps_avx(auVar266,auVar157);
      auVar106._0_4_ = auVar144._0_4_ + auVar68._0_4_;
      auVar106._4_4_ = auVar144._4_4_ + auVar68._4_4_;
      auVar106._8_4_ = auVar144._8_4_ + auVar68._8_4_;
      auVar106._12_4_ = auVar144._12_4_ + auVar68._12_4_;
      auVar140._8_8_ = 0x3f800000;
      auVar140._0_8_ = 0x3f800000;
      auVar144 = vsubps_avx(auVar140,auVar106);
      auVar68 = vsubps_avx(auVar140,auVar171);
      fVar221 = auVar122._0_4_;
      auVar172._0_4_ = fVar221 * auVar144._0_4_;
      fVar222 = auVar122._4_4_;
      auVar172._4_4_ = fVar222 * auVar144._4_4_;
      fVar250 = auVar122._8_4_;
      auVar172._8_4_ = fVar250 * auVar144._8_4_;
      fVar258 = auVar122._12_4_;
      auVar172._12_4_ = fVar258 * auVar144._12_4_;
      fVar162 = auVar123._0_4_;
      auVar107._0_4_ = fVar162 * auVar144._0_4_;
      fVar180 = auVar123._4_4_;
      auVar107._4_4_ = fVar180 * auVar144._4_4_;
      fVar209 = auVar123._8_4_;
      auVar107._8_4_ = fVar209 * auVar144._8_4_;
      fVar220 = auVar123._12_4_;
      auVar107._12_4_ = fVar220 * auVar144._12_4_;
      auVar255._0_4_ = fVar221 * auVar68._0_4_;
      auVar255._4_4_ = fVar222 * auVar68._4_4_;
      auVar255._8_4_ = fVar250 * auVar68._8_4_;
      auVar255._12_4_ = fVar258 * auVar68._12_4_;
      auVar141._0_4_ = fVar162 * auVar68._0_4_;
      auVar141._4_4_ = fVar180 * auVar68._4_4_;
      auVar141._8_4_ = fVar209 * auVar68._8_4_;
      auVar141._12_4_ = fVar220 * auVar68._12_4_;
      auVar144 = vminps_avx(auVar172,auVar255);
      auVar68 = vminps_avx(auVar107,auVar141);
      auVar122 = vminps_avx(auVar144,auVar68);
      auVar144 = vmaxps_avx(auVar255,auVar172);
      auVar68 = vmaxps_avx(auVar141,auVar107);
      auVar123 = vshufps_avx(auVar157,auVar157,0x54);
      auVar68 = vmaxps_avx(auVar68,auVar144);
      auVar124 = vshufps_avx(auVar274,auVar274,0);
      auVar150 = vshufps_avx(auVar274,auVar274,0x55);
      auVar144 = vhaddps_avx(auVar122,auVar122);
      auVar68 = vhaddps_avx(auVar68,auVar68);
      auVar158._0_4_ = auVar124._0_4_ * auVar73._0_4_ + auVar150._0_4_ * auVar201._0_4_;
      auVar158._4_4_ = auVar124._4_4_ * auVar73._4_4_ + auVar150._4_4_ * auVar201._4_4_;
      auVar158._8_4_ = auVar124._8_4_ * auVar73._8_4_ + auVar150._8_4_ * auVar201._8_4_;
      auVar158._12_4_ = auVar124._12_4_ * auVar73._12_4_ + auVar150._12_4_ * auVar201._12_4_;
      auVar122 = vsubps_avx(auVar123,auVar158);
      fVar161 = auVar122._0_4_ + auVar144._0_4_;
      fVar179 = auVar122._0_4_ + auVar68._0_4_;
      auVar144 = vmaxss_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar161));
      auVar68 = vminss_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar163));
    } while (auVar68._0_4_ < auVar144._0_4_);
    auVar144 = vmovshdup_avx(auVar73);
    auVar79._0_4_ = auVar144._0_4_ * auVar100._0_4_;
    auVar79._4_4_ = auVar144._4_4_ * auVar100._4_4_;
    auVar79._8_4_ = auVar144._8_4_ * auVar100._8_4_;
    auVar79._12_4_ = auVar144._12_4_ * auVar100._12_4_;
    auVar108._0_4_ = auVar130._0_4_ * auVar144._0_4_;
    auVar108._4_4_ = auVar130._4_4_ * auVar144._4_4_;
    auVar108._8_4_ = auVar130._8_4_ * auVar144._8_4_;
    auVar108._12_4_ = auVar130._12_4_ * auVar144._12_4_;
    auVar68 = vminps_avx(auVar79,auVar108);
    auVar144 = vmaxps_avx(auVar108,auVar79);
    auVar100 = vmovshdup_avx(auVar201);
    auVar173._0_4_ = auVar67._0_4_ * auVar100._0_4_;
    auVar173._4_4_ = auVar67._4_4_ * auVar100._4_4_;
    auVar173._8_4_ = auVar67._8_4_ * auVar100._8_4_;
    auVar173._12_4_ = auVar67._12_4_ * auVar100._12_4_;
    auVar109._0_4_ = auVar95._0_4_ * auVar100._0_4_;
    auVar109._4_4_ = auVar95._4_4_ * auVar100._4_4_;
    auVar109._8_4_ = auVar95._8_4_ * auVar100._8_4_;
    auVar109._12_4_ = auVar95._12_4_ * auVar100._12_4_;
    auVar100 = vminps_avx(auVar173,auVar109);
    auVar142._0_4_ = auVar68._0_4_ + auVar100._0_4_;
    auVar142._4_4_ = auVar68._4_4_ + auVar100._4_4_;
    auVar142._8_4_ = auVar68._8_4_ + auVar100._8_4_;
    auVar142._12_4_ = auVar68._12_4_ + auVar100._12_4_;
    auVar68 = vmaxps_avx(auVar109,auVar173);
    auVar80._0_4_ = auVar144._0_4_ + auVar68._0_4_;
    auVar80._4_4_ = auVar144._4_4_ + auVar68._4_4_;
    auVar80._8_4_ = auVar144._8_4_ + auVar68._8_4_;
    auVar80._12_4_ = auVar144._12_4_ + auVar68._12_4_;
    auVar144 = vsubps_avx(auVar205,auVar80);
    auVar68 = vsubps_avx(auVar205,auVar142);
    auVar143._0_4_ = fVar221 * auVar144._0_4_;
    auVar143._4_4_ = fVar222 * auVar144._4_4_;
    auVar143._8_4_ = fVar250 * auVar144._8_4_;
    auVar143._12_4_ = fVar258 * auVar144._12_4_;
    auVar174._0_4_ = fVar221 * auVar68._0_4_;
    auVar174._4_4_ = fVar222 * auVar68._4_4_;
    auVar174._8_4_ = fVar250 * auVar68._8_4_;
    auVar174._12_4_ = fVar258 * auVar68._12_4_;
    auVar81._0_4_ = fVar162 * auVar144._0_4_;
    auVar81._4_4_ = fVar180 * auVar144._4_4_;
    auVar81._8_4_ = fVar209 * auVar144._8_4_;
    auVar81._12_4_ = fVar220 * auVar144._12_4_;
    auVar110._0_4_ = fVar162 * auVar68._0_4_;
    auVar110._4_4_ = fVar180 * auVar68._4_4_;
    auVar110._8_4_ = fVar209 * auVar68._8_4_;
    auVar110._12_4_ = fVar220 * auVar68._12_4_;
    auVar144 = vminps_avx(auVar143,auVar174);
    auVar68 = vminps_avx(auVar81,auVar110);
    auVar144 = vminps_avx(auVar144,auVar68);
    auVar68 = vmaxps_avx(auVar174,auVar143);
    auVar100 = vmaxps_avx(auVar110,auVar81);
    auVar144 = vhaddps_avx(auVar144,auVar144);
    auVar68 = vmaxps_avx(auVar100,auVar68);
    auVar68 = vhaddps_avx(auVar68,auVar68);
    auVar100 = vmovshdup_avx(auVar122);
    auVar130 = ZEXT416((uint)(auVar100._0_4_ + auVar144._0_4_));
    auVar144 = vmaxss_avx(auVar207,auVar130);
    auVar100 = ZEXT416((uint)(auVar100._0_4_ + auVar68._0_4_));
    auVar68 = vminss_avx(auVar100,auVar94);
  } while (auVar68._0_4_ < auVar144._0_4_);
  uVar57 = 0;
  if ((fVar178 < fVar161) && (fVar179 < fVar163)) {
    auVar144 = vcmpps_avx(auVar100,auVar94,1);
    auVar68 = vcmpps_avx(auVar207,auVar130,1);
    auVar144 = vandps_avx(auVar68,auVar144);
    uVar57 = auVar144._0_4_;
  }
  auVar231._8_4_ = 0x7fffffff;
  auVar231._0_8_ = 0x7fffffff7fffffff;
  auVar231._12_4_ = 0x7fffffff;
  if (((uint)uVar63 < 4 && 0.001 <= fVar160) && (uVar57 & 1) == 0) goto LAB_007a801c;
  lVar60 = 0xc9;
  do {
    lVar60 = lVar60 + -1;
    if (lVar60 == 0) goto LAB_007a703a;
    fVar160 = auVar122._0_4_;
    fVar163 = 1.0 - fVar160;
    auVar144 = ZEXT416((uint)(fVar163 * fVar163 * fVar163));
    auVar144 = vshufps_avx(auVar144,auVar144,0);
    auVar68 = ZEXT416((uint)(fVar160 * 3.0 * fVar163 * fVar163));
    auVar68 = vshufps_avx(auVar68,auVar68,0);
    auVar100 = ZEXT416((uint)(fVar163 * fVar160 * fVar160 * 3.0));
    auVar100 = vshufps_avx(auVar100,auVar100,0);
    auVar130 = ZEXT416((uint)(fVar160 * fVar160 * fVar160));
    auVar130 = vshufps_avx(auVar130,auVar130,0);
    fVar163 = (float)local_6d0._0_4_ * auVar144._0_4_ +
              local_5b0 * auVar68._0_4_ +
              (float)local_380._0_4_ * auVar130._0_4_ + local_5c0 * auVar100._0_4_;
    fVar160 = (float)local_6d0._4_4_ * auVar144._4_4_ +
              fStack_5ac * auVar68._4_4_ +
              (float)local_380._4_4_ * auVar130._4_4_ + fStack_5bc * auVar100._4_4_;
    auVar82._0_8_ = CONCAT44(fVar160,fVar163);
    auVar82._8_4_ =
         fStack_6c8 * auVar144._8_4_ +
         fStack_5a8 * auVar68._8_4_ + fStack_378 * auVar130._8_4_ + fStack_5b8 * auVar100._8_4_;
    auVar82._12_4_ =
         fStack_6c4 * auVar144._12_4_ +
         fStack_5a4 * auVar68._12_4_ + fStack_374 * auVar130._12_4_ + fStack_5b4 * auVar100._12_4_;
    auVar111._8_8_ = auVar82._0_8_;
    auVar111._0_8_ = auVar82._0_8_;
    auVar68 = vshufpd_avx(auVar82,auVar82,1);
    auVar144 = vmovshdup_avx(auVar122);
    auVar68 = vsubps_avx(auVar68,auVar111);
    auVar83._0_4_ = auVar144._0_4_ * auVar68._0_4_ + fVar163;
    auVar83._4_4_ = auVar144._4_4_ * auVar68._4_4_ + fVar160;
    auVar83._8_4_ = auVar144._8_4_ * auVar68._8_4_ + fVar163;
    auVar83._12_4_ = auVar144._12_4_ * auVar68._12_4_ + fVar160;
    auVar144 = vshufps_avx(auVar83,auVar83,0);
    auVar68 = vshufps_avx(auVar83,auVar83,0x55);
    auVar112._0_4_ = auVar73._0_4_ * auVar144._0_4_ + auVar201._0_4_ * auVar68._0_4_;
    auVar112._4_4_ = auVar73._4_4_ * auVar144._4_4_ + auVar201._4_4_ * auVar68._4_4_;
    auVar112._8_4_ = auVar73._8_4_ * auVar144._8_4_ + auVar201._8_4_ * auVar68._8_4_;
    auVar112._12_4_ = auVar73._12_4_ * auVar144._12_4_ + auVar201._12_4_ * auVar68._12_4_;
    auVar122 = vsubps_avx(auVar122,auVar112);
    auVar144 = vandps_avx(auVar231,auVar83);
    auVar68 = vshufps_avx(auVar144,auVar144,0xf5);
    auVar144 = vmaxss_avx(auVar68,auVar144);
  } while ((float)local_390._0_4_ <= auVar144._0_4_);
  fVar163 = auVar122._0_4_;
  if ((fVar163 < 0.0) || (1.0 < fVar163)) goto LAB_007a703a;
  auVar73 = vmovshdup_avx(auVar122);
  fVar160 = auVar73._0_4_;
  if ((fVar160 < 0.0) || (1.0 < fVar160)) goto LAB_007a703a;
  auVar73 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar95 = vinsertps_avx(auVar73,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar73 = vdpps_avx(auVar95,local_3a0,0x7f);
  auVar201 = vdpps_avx(auVar95,local_3b0,0x7f);
  auVar144 = vdpps_avx(auVar95,local_3e0,0x7f);
  auVar68 = vdpps_avx(auVar95,local_3f0,0x7f);
  auVar100 = vdpps_avx(auVar95,local_400,0x7f);
  auVar130 = vdpps_avx(auVar95,local_410,0x7f);
  fVar180 = 1.0 - fVar160;
  auVar67 = vdpps_avx(auVar95,local_3c0,0x7f);
  auVar95 = vdpps_avx(auVar95,local_3d0,0x7f);
  fVar209 = 1.0 - fVar163;
  fVar178 = auVar122._4_4_;
  fVar161 = auVar122._8_4_;
  fVar179 = auVar122._12_4_;
  fVar162 = fVar209 * fVar163 * fVar163 * 3.0;
  auVar193._0_4_ = fVar163 * fVar163 * fVar163;
  auVar193._4_4_ = fVar178 * fVar178 * fVar178;
  auVar193._8_4_ = fVar161 * fVar161 * fVar161;
  auVar193._12_4_ = fVar179 * fVar179 * fVar179;
  fVar178 = fVar163 * 3.0 * fVar209 * fVar209;
  fVar161 = fVar209 * fVar209 * fVar209;
  fVar163 = (fVar180 * auVar73._0_4_ + fVar160 * auVar144._0_4_) * fVar161 +
            (fVar180 * auVar201._0_4_ + fVar160 * auVar68._0_4_) * fVar178 +
            fVar162 * (fVar180 * auVar67._0_4_ + fVar160 * auVar100._0_4_) +
            auVar193._0_4_ * (auVar130._0_4_ * fVar160 + fVar180 * auVar95._0_4_);
  if ((fVar163 < fVar149) || (fVar160 = *(float *)(ray + k * 4 + 0x100), fVar160 < fVar163))
  goto LAB_007a703a;
  pGVar9 = (context->scene->geometries).items[uVar58].ptr;
  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar55 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_007a7ffd;
    local_f0 = vshufps_avx(auVar122,auVar122,0x55);
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = 0x3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar73 = vsubps_avx(auVar232,local_f0);
    fVar179 = local_f0._0_4_;
    fVar180 = local_f0._4_4_;
    fVar220 = local_f0._8_4_;
    fVar221 = local_f0._12_4_;
    fVar222 = auVar73._0_4_;
    fVar250 = auVar73._4_4_;
    fVar258 = auVar73._8_4_;
    fVar259 = auVar73._12_4_;
    auVar243._0_4_ = fVar179 * (float)local_4e0._0_4_ + fVar222 * (float)local_4d0._0_4_;
    auVar243._4_4_ = fVar180 * (float)local_4e0._4_4_ + fVar250 * (float)local_4d0._4_4_;
    auVar243._8_4_ = fVar220 * fStack_4d8 + fVar258 * fStack_4c8;
    auVar243._12_4_ = fVar221 * fStack_4d4 + fVar259 * fStack_4c4;
    auVar256._0_4_ = fVar179 * (float)local_530._0_4_ + fVar222 * (float)local_510._0_4_;
    auVar256._4_4_ = fVar180 * (float)local_530._4_4_ + fVar250 * (float)local_510._4_4_;
    auVar256._8_4_ = fVar220 * fStack_528 + fVar258 * fStack_508;
    auVar256._12_4_ = fVar221 * fStack_524 + fVar259 * fStack_504;
    auVar267._0_4_ = fVar179 * (float)local_440._0_4_ + fVar222 * (float)local_520._0_4_;
    auVar267._4_4_ = fVar180 * (float)local_440._4_4_ + fVar250 * (float)local_520._4_4_;
    auVar267._8_4_ = fVar220 * fStack_438 + fVar258 * fStack_518;
    auVar267._12_4_ = fVar221 * fStack_434 + fVar259 * fStack_514;
    auVar233._0_4_ = fVar179 * (float)local_500._0_4_ + fVar222 * (float)local_4f0._0_4_;
    auVar233._4_4_ = fVar180 * (float)local_500._4_4_ + fVar250 * (float)local_4f0._4_4_;
    auVar233._8_4_ = fVar220 * fStack_4f8 + fVar258 * fStack_4e8;
    auVar233._12_4_ = fVar221 * fStack_4f4 + fVar259 * fStack_4e4;
    auVar68 = vsubps_avx(auVar256,auVar243);
    auVar100 = vsubps_avx(auVar267,auVar256);
    auVar130 = vsubps_avx(auVar233,auVar267);
    local_110 = vshufps_avx(auVar122,auVar122,0);
    fVar179 = local_110._0_4_;
    fVar220 = local_110._4_4_;
    fVar221 = local_110._8_4_;
    fVar250 = local_110._12_4_;
    auVar73 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
    fVar180 = auVar73._0_4_;
    fVar209 = auVar73._4_4_;
    fVar222 = auVar73._8_4_;
    fVar258 = auVar73._12_4_;
    auVar73 = vshufps_avx(auVar193,auVar193,0);
    auVar201 = vshufps_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),0);
    auVar144 = vshufps_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar178),0);
    auVar175._0_4_ =
         ((auVar100._0_4_ * fVar180 + auVar130._0_4_ * fVar179) * fVar179 +
         (auVar68._0_4_ * fVar180 + auVar100._0_4_ * fVar179) * fVar180) * 3.0;
    auVar175._4_4_ =
         ((auVar100._4_4_ * fVar209 + auVar130._4_4_ * fVar220) * fVar220 +
         (auVar68._4_4_ * fVar209 + auVar100._4_4_ * fVar220) * fVar209) * 3.0;
    auVar175._8_4_ =
         ((auVar100._8_4_ * fVar222 + auVar130._8_4_ * fVar221) * fVar221 +
         (auVar68._8_4_ * fVar222 + auVar100._8_4_ * fVar221) * fVar222) * 3.0;
    auVar175._12_4_ =
         ((auVar100._12_4_ * fVar258 + auVar130._12_4_ * fVar250) * fVar250 +
         (auVar68._12_4_ * fVar258 + auVar100._12_4_ * fVar250) * fVar258) * 3.0;
    auVar68 = vshufps_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),0);
    auVar113._0_4_ =
         auVar68._0_4_ * (float)local_450._0_4_ +
         auVar144._0_4_ * (float)local_460._0_4_ +
         auVar73._0_4_ * (float)local_480._0_4_ + auVar201._0_4_ * (float)local_470._0_4_;
    auVar113._4_4_ =
         auVar68._4_4_ * (float)local_450._4_4_ +
         auVar144._4_4_ * (float)local_460._4_4_ +
         auVar73._4_4_ * (float)local_480._4_4_ + auVar201._4_4_ * (float)local_470._4_4_;
    auVar113._8_4_ =
         auVar68._8_4_ * fStack_448 +
         auVar144._8_4_ * fStack_458 + auVar73._8_4_ * fStack_478 + auVar201._8_4_ * fStack_468;
    auVar113._12_4_ =
         auVar68._12_4_ * fStack_444 +
         auVar144._12_4_ * fStack_454 + auVar73._12_4_ * fStack_474 + auVar201._12_4_ * fStack_464;
    auVar73 = vshufps_avx(auVar175,auVar175,0xc9);
    auVar145._0_4_ = auVar113._0_4_ * auVar73._0_4_;
    auVar145._4_4_ = auVar113._4_4_ * auVar73._4_4_;
    auVar145._8_4_ = auVar113._8_4_ * auVar73._8_4_;
    auVar145._12_4_ = auVar113._12_4_ * auVar73._12_4_;
    auVar73 = vshufps_avx(auVar113,auVar113,0xc9);
    auVar114._0_4_ = auVar175._0_4_ * auVar73._0_4_;
    auVar114._4_4_ = auVar175._4_4_ * auVar73._4_4_;
    auVar114._8_4_ = auVar175._8_4_ * auVar73._8_4_;
    auVar114._12_4_ = auVar175._12_4_ * auVar73._12_4_;
    auVar73 = vsubps_avx(auVar114,auVar145);
    local_170 = vshufps_avx(auVar73,auVar73,0x55);
    local_180[0] = (RTCHitN)local_170[0];
    local_180[1] = (RTCHitN)local_170[1];
    local_180[2] = (RTCHitN)local_170[2];
    local_180[3] = (RTCHitN)local_170[3];
    local_180[4] = (RTCHitN)local_170[4];
    local_180[5] = (RTCHitN)local_170[5];
    local_180[6] = (RTCHitN)local_170[6];
    local_180[7] = (RTCHitN)local_170[7];
    local_180[8] = (RTCHitN)local_170[8];
    local_180[9] = (RTCHitN)local_170[9];
    local_180[10] = (RTCHitN)local_170[10];
    local_180[0xb] = (RTCHitN)local_170[0xb];
    local_180[0xc] = (RTCHitN)local_170[0xc];
    local_180[0xd] = (RTCHitN)local_170[0xd];
    local_180[0xe] = (RTCHitN)local_170[0xe];
    local_180[0xf] = (RTCHitN)local_170[0xf];
    local_150 = vshufps_avx(auVar73,auVar73,0xaa);
    local_160 = local_150;
    local_130 = vshufps_avx(auVar73,auVar73,0);
    local_140 = local_130;
    local_120 = local_110;
    local_100 = local_f0;
    local_e0 = local_320._0_8_;
    uStack_d8 = local_320._8_8_;
    uStack_d0 = local_320._16_8_;
    uStack_c8 = local_320._24_8_;
    local_c0 = local_300;
    vcmpps_avx(local_300,local_300,0xf);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar163;
    local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar56 & 0xf) << 4));
    local_570 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar56 >> 4) * 0x10);
    local_4b0.valid = (int *)local_580;
    local_4b0.geometryUserPtr = pGVar9->userPtr;
    local_4b0.context = context->user;
    local_4b0.ray = (RTCRayN *)ray;
    local_4b0.hit = local_180;
    local_4b0.N = 8;
    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar9->occlusionFilterN)(&local_4b0);
    }
    auVar73 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
    auVar201 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
    auVar148._16_16_ = auVar201;
    auVar148._0_16_ = auVar73;
    auVar85 = _DAT_01f7b020 & ~auVar148;
    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar85 >> 0x7f,0) != '\0') ||
          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar85 >> 0xbf,0) != '\0') ||
        (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar85[0x1f] < '\0')
    {
      p_Var10 = context->args->filter;
      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var10)(&local_4b0);
      }
      auVar73 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
      auVar201 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
      auVar91._16_16_ = auVar201;
      auVar91._0_16_ = auVar73;
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
      auVar85 = vblendvps_avx(auVar119,*(undefined1 (*) [32])(local_4b0.ray + 0x100),auVar91);
      *(undefined1 (*) [32])(local_4b0.ray + 0x100) = auVar85;
      auVar85 = _DAT_01f7b020 & ~auVar91;
      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar85 >> 0x7f,0) != '\0') ||
            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar85 >> 0xbf,0) != '\0') ||
          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar85[0x1f] < '\0') {
        bVar55 = 1;
        goto LAB_007a7ffd;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar160;
  }
  bVar55 = 0;
LAB_007a7ffd:
  bVar65 = (bool)(bVar65 | bVar55);
  goto LAB_007a703a;
LAB_007a801c:
  auVar73 = vinsertps_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar163),0x10);
  auVar303 = ZEXT1664(auVar73);
  auVar297 = ZEXT1664(auVar207);
  goto LAB_007a69cb;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }